

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::sse2::CurveNiIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  float *pfVar2;
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined3 uVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined6 uVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  RayQueryContext *pRVar40;
  byte bVar41;
  ulong uVar43;
  ulong uVar44;
  bool bVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  int iVar49;
  uint uVar50;
  uint uVar51;
  short sVar52;
  float fVar53;
  float fVar93;
  float fVar94;
  vfloat_impl<4> p00;
  undefined2 uVar92;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar95;
  undefined8 uVar96;
  float fVar114;
  float fVar115;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar113 [16];
  float fVar116;
  float fVar128;
  float fVar129;
  vfloat4 v;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar130;
  float fVar135;
  float fVar136;
  vfloat4 v_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  float fVar150;
  float fVar151;
  vfloat4 a;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar152;
  float fVar179;
  float fVar180;
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar181;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar189;
  float fVar198;
  float fVar199;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar200;
  float fVar212;
  float fVar213;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar222;
  float fVar223;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar224;
  float fVar225;
  float fVar231;
  float fVar233;
  vfloat4 a_1;
  float fVar232;
  float fVar234;
  float fVar235;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar236;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar246;
  float fVar247;
  float fVar254;
  undefined8 uVar248;
  float fVar253;
  float fVar255;
  float fVar257;
  undefined1 auVar249 [16];
  float fVar256;
  float fVar258;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar259;
  float fVar263;
  float fVar264;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3d4;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  float fStack_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  RayQueryContext *local_290;
  RTCFilterFunctionNArguments local_288;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint auStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  uint local_1e4;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  ulong uVar42;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 uVar91;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  
  PVar3 = prim[1];
  uVar42 = (ulong)(byte)PVar3;
  pPVar1 = prim + uVar42 * 0x19 + 6;
  fVar129 = *(float *)(pPVar1 + 0xc);
  fVar130 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar1) * fVar129;
  fVar135 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar1 + 4)) * fVar129;
  fVar136 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar1 + 8)) * fVar129;
  fVar116 = fVar129 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar128 = fVar129 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar129 = fVar129 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar4 = *(undefined4 *)(prim + uVar42 * 4 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar52 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar22,sVar52);
  auVar102._8_4_ = 0;
  auVar102._0_8_ = uVar43;
  auVar102._12_2_ = uVar92;
  auVar102._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar203._12_4_ = auVar102._12_4_;
  auVar203._8_2_ = 0;
  auVar203._0_8_ = uVar43;
  auVar203._10_2_ = uVar92;
  auVar61._10_6_ = auVar203._10_6_;
  auVar61._8_2_ = uVar92;
  auVar61._0_8_ = uVar43;
  uVar92 = (undefined2)uVar22;
  auVar23._4_8_ = auVar61._8_8_;
  auVar23._2_2_ = uVar92;
  auVar23._0_2_ = uVar92;
  fVar95 = (float)((int)sVar52 >> 8);
  fVar114 = (float)(auVar23._0_4_ >> 0x18);
  fVar115 = (float)(auVar61._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar42 * 5 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar52 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar22,sVar52);
  auVar54._8_4_ = 0;
  auVar54._0_8_ = uVar43;
  auVar54._12_2_ = uVar92;
  auVar54._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar216._12_4_ = auVar54._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar43;
  auVar216._10_2_ = uVar92;
  auVar120._10_6_ = auVar216._10_6_;
  auVar120._8_2_ = uVar92;
  auVar120._0_8_ = uVar43;
  uVar92 = (undefined2)uVar22;
  auVar24._4_8_ = auVar120._8_8_;
  auVar24._2_2_ = uVar92;
  auVar24._0_2_ = uVar92;
  fVar137 = (float)((int)sVar52 >> 8);
  fVar150 = (float)(auVar24._0_4_ >> 0x18);
  fVar151 = (float)(auVar120._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar42 * 6 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar52 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar22,sVar52);
  auVar57._8_4_ = 0;
  auVar57._0_8_ = uVar43;
  auVar57._12_2_ = uVar92;
  auVar57._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar56._12_4_ = auVar57._12_4_;
  auVar56._8_2_ = 0;
  auVar56._0_8_ = uVar43;
  auVar56._10_2_ = uVar92;
  auVar55._10_6_ = auVar56._10_6_;
  auVar55._8_2_ = uVar92;
  auVar55._0_8_ = uVar43;
  uVar92 = (undefined2)uVar22;
  auVar25._4_8_ = auVar55._8_8_;
  auVar25._2_2_ = uVar92;
  auVar25._0_2_ = uVar92;
  fVar189 = (float)((int)sVar52 >> 8);
  fVar198 = (float)(auVar25._0_4_ >> 0x18);
  fVar199 = (float)(auVar55._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar42 * 0xb + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar52 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar22,sVar52);
  auVar60._8_4_ = 0;
  auVar60._0_8_ = uVar43;
  auVar60._12_2_ = uVar92;
  auVar60._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar43;
  auVar59._10_2_ = uVar92;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._8_2_ = uVar92;
  auVar58._0_8_ = uVar43;
  uVar92 = (undefined2)uVar22;
  auVar26._4_8_ = auVar58._8_8_;
  auVar26._2_2_ = uVar92;
  auVar26._0_2_ = uVar92;
  fVar53 = (float)((int)sVar52 >> 8);
  fVar93 = (float)(auVar26._0_4_ >> 0x18);
  fVar94 = (float)(auVar58._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar42 * 0xc + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar52 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar22,sVar52);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar43;
  auVar155._12_2_ = uVar92;
  auVar155._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar43;
  auVar154._10_2_ = uVar92;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar92;
  auVar153._0_8_ = uVar43;
  uVar92 = (undefined2)uVar22;
  auVar27._4_8_ = auVar153._8_8_;
  auVar27._2_2_ = uVar92;
  auVar27._0_2_ = uVar92;
  fVar181 = (float)((int)sVar52 >> 8);
  fVar187 = (float)(auVar27._0_4_ >> 0x18);
  fVar188 = (float)(auVar153._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar42 * 0xd + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar52 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar22,sVar52);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar43;
  auVar158._12_2_ = uVar92;
  auVar158._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar43;
  auVar157._10_2_ = uVar92;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._8_2_ = uVar92;
  auVar156._0_8_ = uVar43;
  uVar92 = (undefined2)uVar22;
  auVar28._4_8_ = auVar156._8_8_;
  auVar28._2_2_ = uVar92;
  auVar28._0_2_ = uVar92;
  fVar214 = (float)((int)sVar52 >> 8);
  fVar222 = (float)(auVar28._0_4_ >> 0x18);
  fVar223 = (float)(auVar156._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar42 * 0x12 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar52 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar22,sVar52);
  auVar161._8_4_ = 0;
  auVar161._0_8_ = uVar43;
  auVar161._12_2_ = uVar92;
  auVar161._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._8_2_ = 0;
  auVar160._0_8_ = uVar43;
  auVar160._10_2_ = uVar92;
  auVar159._10_6_ = auVar160._10_6_;
  auVar159._8_2_ = uVar92;
  auVar159._0_8_ = uVar43;
  uVar92 = (undefined2)uVar22;
  auVar29._4_8_ = auVar159._8_8_;
  auVar29._2_2_ = uVar92;
  auVar29._0_2_ = uVar92;
  fVar200 = (float)((int)sVar52 >> 8);
  fVar212 = (float)(auVar29._0_4_ >> 0x18);
  fVar213 = (float)(auVar159._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar42 * 0x13 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar52 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar22,sVar52);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar43;
  auVar164._12_2_ = uVar92;
  auVar164._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar43;
  auVar163._10_2_ = uVar92;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._8_2_ = uVar92;
  auVar162._0_8_ = uVar43;
  uVar92 = (undefined2)uVar22;
  auVar30._4_8_ = auVar162._8_8_;
  auVar30._2_2_ = uVar92;
  auVar30._0_2_ = uVar92;
  fVar224 = (float)((int)sVar52 >> 8);
  fVar231 = (float)(auVar30._0_4_ >> 0x18);
  fVar233 = (float)(auVar162._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar42 * 0x14 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar52 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar22,sVar52);
  auVar167._8_4_ = 0;
  auVar167._0_8_ = uVar43;
  auVar167._12_2_ = uVar92;
  auVar167._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._8_2_ = 0;
  auVar166._0_8_ = uVar43;
  auVar166._10_2_ = uVar92;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._8_2_ = uVar92;
  auVar165._0_8_ = uVar43;
  uVar92 = (undefined2)uVar22;
  auVar31._4_8_ = auVar165._8_8_;
  auVar31._2_2_ = uVar92;
  auVar31._0_2_ = uVar92;
  fVar259 = (float)((int)sVar52 >> 8);
  fVar263 = (float)(auVar31._0_4_ >> 0x18);
  fVar264 = (float)(auVar165._8_4_ >> 0x18);
  fVar246 = fVar116 * fVar95 + fVar128 * fVar137 + fVar129 * fVar189;
  fVar253 = fVar116 * fVar114 + fVar128 * fVar150 + fVar129 * fVar198;
  fVar255 = fVar116 * fVar115 + fVar128 * fVar151 + fVar129 * fVar199;
  fVar257 = fVar116 * (float)(auVar203._12_4_ >> 0x18) +
            fVar128 * (float)(auVar216._12_4_ >> 0x18) + fVar129 * (float)(auVar56._12_4_ >> 0x18);
  fVar236 = fVar116 * fVar53 + fVar128 * fVar181 + fVar129 * fVar214;
  fVar243 = fVar116 * fVar93 + fVar128 * fVar187 + fVar129 * fVar222;
  fVar244 = fVar116 * fVar94 + fVar128 * fVar188 + fVar129 * fVar223;
  fVar245 = fVar116 * (float)(auVar59._12_4_ >> 0x18) +
            fVar128 * (float)(auVar154._12_4_ >> 0x18) + fVar129 * (float)(auVar157._12_4_ >> 0x18);
  fVar152 = fVar116 * fVar200 + fVar128 * fVar224 + fVar129 * fVar259;
  fVar179 = fVar116 * fVar212 + fVar128 * fVar231 + fVar129 * fVar263;
  fVar180 = fVar116 * fVar213 + fVar128 * fVar233 + fVar129 * fVar264;
  fVar116 = fVar116 * (float)(auVar160._12_4_ >> 0x18) +
            fVar128 * (float)(auVar163._12_4_ >> 0x18) + fVar129 * (float)(auVar166._12_4_ >> 0x18);
  fVar137 = fVar95 * fVar130 + fVar137 * fVar135 + fVar189 * fVar136;
  fVar150 = fVar114 * fVar130 + fVar150 * fVar135 + fVar198 * fVar136;
  fVar151 = fVar115 * fVar130 + fVar151 * fVar135 + fVar199 * fVar136;
  fVar189 = (float)(auVar203._12_4_ >> 0x18) * fVar130 +
            (float)(auVar216._12_4_ >> 0x18) * fVar135 + (float)(auVar56._12_4_ >> 0x18) * fVar136;
  fVar199 = fVar53 * fVar130 + fVar181 * fVar135 + fVar214 * fVar136;
  fVar214 = fVar93 * fVar130 + fVar187 * fVar135 + fVar222 * fVar136;
  fVar222 = fVar94 * fVar130 + fVar188 * fVar135 + fVar223 * fVar136;
  fVar223 = (float)(auVar59._12_4_ >> 0x18) * fVar130 +
            (float)(auVar154._12_4_ >> 0x18) * fVar135 + (float)(auVar157._12_4_ >> 0x18) * fVar136;
  fVar181 = fVar130 * fVar200 + fVar135 * fVar224 + fVar136 * fVar259;
  fVar187 = fVar130 * fVar212 + fVar135 * fVar231 + fVar136 * fVar263;
  fVar188 = fVar130 * fVar213 + fVar135 * fVar233 + fVar136 * fVar264;
  fVar198 = fVar130 * (float)(auVar160._12_4_ >> 0x18) +
            fVar135 * (float)(auVar163._12_4_ >> 0x18) + fVar136 * (float)(auVar166._12_4_ >> 0x18);
  fVar129 = (float)DAT_01f4bd50;
  fVar53 = DAT_01f4bd50._4_4_;
  fVar93 = DAT_01f4bd50._8_4_;
  fVar94 = DAT_01f4bd50._12_4_;
  uVar46 = -(uint)(fVar129 <= ABS(fVar246));
  uVar48 = -(uint)(fVar53 <= ABS(fVar253));
  uVar50 = -(uint)(fVar93 <= ABS(fVar255));
  uVar51 = -(uint)(fVar94 <= ABS(fVar257));
  auVar249._0_4_ = (uint)fVar246 & uVar46;
  auVar249._4_4_ = (uint)fVar253 & uVar48;
  auVar249._8_4_ = (uint)fVar255 & uVar50;
  auVar249._12_4_ = (uint)fVar257 & uVar51;
  auVar131._0_4_ = ~uVar46 & (uint)fVar129;
  auVar131._4_4_ = ~uVar48 & (uint)fVar53;
  auVar131._8_4_ = ~uVar50 & (uint)fVar93;
  auVar131._12_4_ = ~uVar51 & (uint)fVar94;
  auVar131 = auVar131 | auVar249;
  uVar46 = -(uint)(fVar129 <= ABS(fVar236));
  uVar48 = -(uint)(fVar53 <= ABS(fVar243));
  uVar50 = -(uint)(fVar93 <= ABS(fVar244));
  uVar51 = -(uint)(fVar94 <= ABS(fVar245));
  auVar237._0_4_ = (uint)fVar236 & uVar46;
  auVar237._4_4_ = (uint)fVar243 & uVar48;
  auVar237._8_4_ = (uint)fVar244 & uVar50;
  auVar237._12_4_ = (uint)fVar245 & uVar51;
  auVar138._0_4_ = ~uVar46 & (uint)fVar129;
  auVar138._4_4_ = ~uVar48 & (uint)fVar53;
  auVar138._8_4_ = ~uVar50 & (uint)fVar93;
  auVar138._12_4_ = ~uVar51 & (uint)fVar94;
  auVar138 = auVar138 | auVar237;
  uVar46 = -(uint)(fVar129 <= ABS(fVar152));
  uVar48 = -(uint)(fVar53 <= ABS(fVar179));
  uVar50 = -(uint)(fVar93 <= ABS(fVar180));
  uVar51 = -(uint)(fVar94 <= ABS(fVar116));
  auVar168._0_4_ = (uint)fVar152 & uVar46;
  auVar168._4_4_ = (uint)fVar179 & uVar48;
  auVar168._8_4_ = (uint)fVar180 & uVar50;
  auVar168._12_4_ = (uint)fVar116 & uVar51;
  auVar201._0_4_ = ~uVar46 & (uint)fVar129;
  auVar201._4_4_ = ~uVar48 & (uint)fVar53;
  auVar201._8_4_ = ~uVar50 & (uint)fVar93;
  auVar201._12_4_ = ~uVar51 & (uint)fVar94;
  auVar201 = auVar201 | auVar168;
  auVar61 = rcpps(_DAT_01f4bd50,auVar131);
  fVar129 = auVar61._0_4_;
  fVar94 = auVar61._4_4_;
  fVar115 = auVar61._8_4_;
  fVar130 = auVar61._12_4_;
  fVar129 = (1.0 - auVar131._0_4_ * fVar129) * fVar129 + fVar129;
  fVar94 = (1.0 - auVar131._4_4_ * fVar94) * fVar94 + fVar94;
  fVar115 = (1.0 - auVar131._8_4_ * fVar115) * fVar115 + fVar115;
  fVar130 = (1.0 - auVar131._12_4_ * fVar130) * fVar130 + fVar130;
  auVar61 = rcpps(auVar61,auVar138);
  fVar53 = auVar61._0_4_;
  fVar95 = auVar61._4_4_;
  fVar116 = auVar61._8_4_;
  fVar135 = auVar61._12_4_;
  fVar53 = (1.0 - auVar138._0_4_ * fVar53) * fVar53 + fVar53;
  fVar95 = (1.0 - auVar138._4_4_ * fVar95) * fVar95 + fVar95;
  fVar116 = (1.0 - auVar138._8_4_ * fVar116) * fVar116 + fVar116;
  fVar135 = (1.0 - auVar138._12_4_ * fVar135) * fVar135 + fVar135;
  auVar61 = rcpps(auVar61,auVar201);
  fVar93 = auVar61._0_4_;
  fVar114 = auVar61._4_4_;
  fVar128 = auVar61._8_4_;
  fVar136 = auVar61._12_4_;
  fVar93 = (1.0 - auVar201._0_4_ * fVar93) * fVar93 + fVar93;
  fVar114 = (1.0 - auVar201._4_4_ * fVar114) * fVar114 + fVar114;
  fVar128 = (1.0 - auVar201._8_4_ * fVar128) * fVar128 + fVar128;
  fVar136 = (1.0 - auVar201._12_4_ * fVar136) * fVar136 + fVar136;
  uVar43 = *(ulong *)(prim + uVar42 * 7 + 6);
  uVar92 = (undefined2)(uVar43 >> 0x30);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar43;
  auVar64._12_2_ = uVar92;
  auVar64._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar43 >> 0x20);
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar43;
  auVar63._10_2_ = uVar92;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._8_2_ = uVar92;
  auVar62._0_8_ = uVar43;
  uVar92 = (undefined2)(uVar43 >> 0x10);
  auVar32._4_8_ = auVar62._8_8_;
  auVar32._2_2_ = uVar92;
  auVar32._0_2_ = uVar92;
  auVar132._0_8_ =
       CONCAT44(((float)(auVar32._0_4_ >> 0x10) - fVar150) * fVar94,
                ((float)(int)(short)uVar43 - fVar137) * fVar129);
  auVar132._8_4_ = ((float)(auVar62._8_4_ >> 0x10) - fVar151) * fVar115;
  auVar132._12_4_ = ((float)(auVar63._12_4_ >> 0x10) - fVar189) * fVar130;
  uVar43 = *(ulong *)(prim + uVar42 * 9 + 6);
  uVar92 = (undefined2)(uVar43 >> 0x30);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar43;
  auVar67._12_2_ = uVar92;
  auVar67._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar43 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar43;
  auVar66._10_2_ = uVar92;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar92;
  auVar65._0_8_ = uVar43;
  uVar92 = (undefined2)(uVar43 >> 0x10);
  auVar33._4_8_ = auVar65._8_8_;
  auVar33._2_2_ = uVar92;
  auVar33._0_2_ = uVar92;
  auVar169._0_4_ = ((float)(int)(short)uVar43 - fVar137) * fVar129;
  auVar169._4_4_ = ((float)(auVar33._0_4_ >> 0x10) - fVar150) * fVar94;
  auVar169._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar151) * fVar115;
  auVar169._12_4_ = ((float)(auVar66._12_4_ >> 0x10) - fVar189) * fVar130;
  uVar43 = *(ulong *)(prim + uVar42 * 0xe + 6);
  uVar92 = (undefined2)(uVar43 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar43;
  auVar70._12_2_ = uVar92;
  auVar70._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar43 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar43;
  auVar69._10_2_ = uVar92;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar92;
  auVar68._0_8_ = uVar43;
  uVar92 = (undefined2)(uVar43 >> 0x10);
  auVar34._4_8_ = auVar68._8_8_;
  auVar34._2_2_ = uVar92;
  auVar34._0_2_ = uVar92;
  auVar97._0_8_ =
       CONCAT44(((float)(auVar34._0_4_ >> 0x10) - fVar214) * fVar95,
                ((float)(int)(short)uVar43 - fVar199) * fVar53);
  auVar97._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar222) * fVar116;
  auVar97._12_4_ = ((float)(auVar69._12_4_ >> 0x10) - fVar223) * fVar135;
  uVar43 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  uVar92 = (undefined2)(uVar43 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar43;
  auVar73._12_2_ = uVar92;
  auVar73._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar43 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar43;
  auVar72._10_2_ = uVar92;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar92;
  auVar71._0_8_ = uVar43;
  uVar92 = (undefined2)(uVar43 >> 0x10);
  auVar35._4_8_ = auVar71._8_8_;
  auVar35._2_2_ = uVar92;
  auVar35._0_2_ = uVar92;
  auVar190._0_4_ = ((float)(int)(short)uVar43 - fVar199) * fVar53;
  auVar190._4_4_ = ((float)(auVar35._0_4_ >> 0x10) - fVar214) * fVar95;
  auVar190._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar222) * fVar116;
  auVar190._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar223) * fVar135;
  uVar43 = *(ulong *)(prim + uVar42 * 0x15 + 6);
  uVar92 = (undefined2)(uVar43 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar43;
  auVar76._12_2_ = uVar92;
  auVar76._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar43 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar43;
  auVar75._10_2_ = uVar92;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar92;
  auVar74._0_8_ = uVar43;
  uVar92 = (undefined2)(uVar43 >> 0x10);
  auVar36._4_8_ = auVar74._8_8_;
  auVar36._2_2_ = uVar92;
  auVar36._0_2_ = uVar92;
  auVar77._0_8_ =
       CONCAT44(((float)(auVar36._0_4_ >> 0x10) - fVar187) * fVar114,
                ((float)(int)(short)uVar43 - fVar181) * fVar93);
  auVar77._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar188) * fVar128;
  auVar77._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar198) * fVar136;
  uVar43 = *(ulong *)(prim + uVar42 * 0x17 + 6);
  uVar92 = (undefined2)(uVar43 >> 0x30);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar43;
  auVar184._12_2_ = uVar92;
  auVar184._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar43 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar43;
  auVar183._10_2_ = uVar92;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar92;
  auVar182._0_8_ = uVar43;
  uVar92 = (undefined2)(uVar43 >> 0x10);
  auVar37._4_8_ = auVar182._8_8_;
  auVar37._2_2_ = uVar92;
  auVar37._0_2_ = uVar92;
  auVar185._0_4_ = ((float)(int)(short)uVar43 - fVar181) * fVar93;
  auVar185._4_4_ = ((float)(auVar37._0_4_ >> 0x10) - fVar187) * fVar114;
  auVar185._8_4_ = ((float)(auVar182._8_4_ >> 0x10) - fVar188) * fVar128;
  auVar185._12_4_ = ((float)(auVar183._12_4_ >> 0x10) - fVar198) * fVar136;
  auVar202._8_4_ = auVar132._8_4_;
  auVar202._0_8_ = auVar132._0_8_;
  auVar202._12_4_ = auVar132._12_4_;
  auVar203 = minps(auVar202,auVar169);
  auVar117._8_4_ = auVar97._8_4_;
  auVar117._0_8_ = auVar97._0_8_;
  auVar117._12_4_ = auVar97._12_4_;
  auVar61 = minps(auVar117,auVar190);
  auVar203 = maxps(auVar203,auVar61);
  auVar118._8_4_ = auVar77._8_4_;
  auVar118._0_8_ = auVar77._0_8_;
  auVar118._12_4_ = auVar77._12_4_;
  auVar61 = minps(auVar118,auVar185);
  uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar139._4_4_ = uVar4;
  auVar139._0_4_ = uVar4;
  auVar139._8_4_ = uVar4;
  auVar139._12_4_ = uVar4;
  auVar61 = maxps(auVar61,auVar139);
  auVar61 = maxps(auVar203,auVar61);
  local_1c8 = auVar61._0_4_ * 0.99999964;
  fStack_1c4 = auVar61._4_4_ * 0.99999964;
  fStack_1c0 = auVar61._8_4_ * 0.99999964;
  fStack_1bc = auVar61._12_4_ * 0.99999964;
  auVar203 = maxps(auVar132,auVar169);
  auVar61 = maxps(auVar97,auVar190);
  auVar203 = minps(auVar203,auVar61);
  auVar61 = maxps(auVar77,auVar185);
  fVar129 = (ray->super_RayK<1>).tfar;
  auVar98._4_4_ = fVar129;
  auVar98._0_4_ = fVar129;
  auVar98._8_4_ = fVar129;
  auVar98._12_4_ = fVar129;
  auVar61 = minps(auVar61,auVar98);
  auVar61 = minps(auVar203,auVar61);
  auVar99._0_4_ = -(uint)(PVar3 != (Primitive)0x0 && local_1c8 <= auVar61._0_4_ * 1.0000004);
  auVar99._4_4_ = -(uint)(1 < (byte)PVar3 && fStack_1c4 <= auVar61._4_4_ * 1.0000004);
  auVar99._8_4_ = -(uint)(2 < (byte)PVar3 && fStack_1c0 <= auVar61._8_4_ * 1.0000004);
  auVar99._12_4_ = -(uint)(3 < (byte)PVar3 && fStack_1bc <= auVar61._12_4_ * 1.0000004);
  uVar46 = movmskps((uint)(byte)PVar3,auVar99);
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
  local_290 = context;
LAB_0030a6e1:
  pRVar40 = local_290;
  uVar43 = (ulong)uVar46;
  if (uVar43 == 0) {
    return;
  }
  lVar9 = 0;
  if (uVar43 != 0) {
    for (; (uVar46 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  uVar46 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar46].ptr;
  local_3d4._4_8_ = (ulong)*(uint *)(prim + lVar9 * 4 + 6);
  uVar44 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar9 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar2 = (float *)(_Var8 + uVar44 * (long)pvVar7);
  fVar129 = *pfVar2;
  fVar53 = pfVar2[1];
  fVar93 = pfVar2[2];
  fVar94 = pfVar2[3];
  pfVar2 = (float *)(_Var8 + (uVar44 + 1) * (long)pvVar7);
  fVar95 = *pfVar2;
  fVar114 = pfVar2[1];
  fVar115 = pfVar2[2];
  fVar116 = pfVar2[3];
  pfVar2 = (float *)(_Var8 + (uVar44 + 2) * (long)pvVar7);
  fVar128 = *pfVar2;
  fVar130 = pfVar2[1];
  fVar135 = pfVar2[2];
  fVar136 = pfVar2[3];
  pfVar2 = (float *)(_Var8 + (long)pvVar7 * (uVar44 + 3));
  fVar137 = *pfVar2;
  fVar150 = pfVar2[1];
  fVar151 = pfVar2[2];
  fVar189 = pfVar2[3];
  uVar43 = uVar43 - 1 & uVar43;
  uVar42 = *(ulong *)&pGVar5[1].time_range.upper;
  pfVar2 = (float *)(uVar42 + (long)p_Var6 * uVar44);
  fVar181 = *pfVar2;
  fVar187 = pfVar2[1];
  fVar188 = pfVar2[2];
  fVar198 = pfVar2[3];
  pfVar2 = (float *)(uVar42 + (long)p_Var6 * (uVar44 + 1));
  fVar152 = *pfVar2;
  fVar179 = pfVar2[1];
  fVar180 = pfVar2[2];
  fVar199 = pfVar2[3];
  pfVar2 = (float *)(uVar42 + (long)p_Var6 * (uVar44 + 2));
  fVar200 = *pfVar2;
  fVar212 = pfVar2[1];
  fVar213 = pfVar2[2];
  fVar214 = pfVar2[3];
  lVar9 = 0;
  if (uVar43 != 0) {
    for (; (uVar43 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  pfVar2 = (float *)(uVar42 + (long)p_Var6 * (uVar44 + 3));
  fVar222 = *pfVar2;
  fVar223 = pfVar2[1];
  fVar224 = pfVar2[2];
  fVar231 = pfVar2[3];
  if (((uVar43 != 0) && (uVar44 = uVar43 - 1 & uVar43, uVar44 != 0)) && (lVar9 = 0, uVar44 != 0)) {
    for (; (uVar44 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  fVar233 = fVar200 * 0.0 + fVar222 * -0.0 + fVar152 + fVar181 * -0.0;
  fVar236 = fVar212 * 0.0 + fVar223 * -0.0 + fVar179 + fVar187 * -0.0;
  fVar243 = fVar213 * 0.0 + fVar224 * -0.0 + fVar180 + fVar188 * -0.0;
  fVar244 = fVar214 * 0.0 + fVar231 * -0.0 + fVar199 + fVar198 * -0.0;
  fVar245 = (fVar200 * 0.5 + fVar222 * 0.0 + fVar152 * 0.0) - fVar181 * 0.5;
  fVar246 = (fVar212 * 0.5 + fVar223 * 0.0 + fVar179 * 0.0) - fVar187 * 0.5;
  fVar253 = (fVar213 * 0.5 + fVar224 * 0.0 + fVar180 * 0.0) - fVar188 * 0.5;
  fVar255 = (fVar214 * 0.5 + fVar231 * 0.0 + fVar199 * 0.0) - fVar198 * 0.5;
  fVar247 = (fVar128 * 0.5 + fVar137 * 0.0 + fVar95 * 0.0) - fVar129 * 0.5;
  fVar254 = (fVar130 * 0.5 + fVar150 * 0.0 + fVar114 * 0.0) - fVar53 * 0.5;
  fVar256 = (fVar135 * 0.5 + fVar151 * 0.0 + fVar115 * 0.0) - fVar93 * 0.5;
  fVar258 = (fVar136 * 0.5 + fVar189 * 0.0 + fVar116 * 0.0) - fVar94 * 0.5;
  fVar225 = fVar128 * 0.0 + fVar137 * -0.0 + fVar95 + fVar129 * -0.0;
  fVar232 = fVar130 * 0.0 + fVar150 * -0.0 + fVar114 + fVar53 * -0.0;
  fVar234 = fVar135 * 0.0 + fVar151 * -0.0 + fVar115 + fVar93 * -0.0;
  fVar235 = fVar136 * 0.0 + fVar189 * -0.0 + fVar116 + fVar94 * -0.0;
  fVar257 = fVar222 * -0.0 + fVar200 + fVar152 * 0.0 + fVar181 * -0.0;
  fVar259 = fVar223 * -0.0 + fVar212 + fVar179 * 0.0 + fVar187 * -0.0;
  fVar263 = fVar224 * -0.0 + fVar213 + fVar180 * 0.0 + fVar188 * -0.0;
  fVar264 = fVar231 * -0.0 + fVar214 + fVar199 * 0.0 + fVar198 * -0.0;
  fVar181 = fVar181 * 0.0 + ((fVar222 * 0.5 + fVar200 * 0.0) - fVar152 * 0.5);
  fVar187 = fVar187 * 0.0 + ((fVar223 * 0.5 + fVar212 * 0.0) - fVar179 * 0.5);
  fVar188 = fVar188 * 0.0 + ((fVar224 * 0.5 + fVar213 * 0.0) - fVar180 * 0.5);
  fVar198 = fVar198 * 0.0 + ((fVar231 * 0.5 + fVar214 * 0.0) - fVar199 * 0.5);
  fVar152 = fVar137 * -0.0 + fVar128 + fVar95 * 0.0 + fVar129 * -0.0;
  fVar179 = fVar150 * -0.0 + fVar130 + fVar114 * 0.0 + fVar53 * -0.0;
  fVar180 = fVar151 * -0.0 + fVar135 + fVar115 * 0.0 + fVar93 * -0.0;
  fVar199 = fVar189 * -0.0 + fVar136 + fVar116 * 0.0 + fVar94 * -0.0;
  fVar129 = fVar129 * 0.0 + ((fVar137 * 0.5 + fVar128 * 0.0) - fVar95 * 0.5);
  fVar53 = fVar53 * 0.0 + ((fVar150 * 0.5 + fVar130 * 0.0) - fVar114 * 0.5);
  fVar93 = fVar93 * 0.0 + ((fVar151 * 0.5 + fVar135 * 0.0) - fVar115 * 0.5);
  fVar94 = fVar94 * 0.0 + ((fVar189 * 0.5 + fVar136 * 0.0) - fVar116 * 0.5);
  fVar212 = fVar246 * fVar225 - fVar232 * fVar245;
  fVar214 = fVar253 * fVar232 - fVar234 * fVar246;
  fVar222 = fVar245 * fVar234 - fVar225 * fVar253;
  fVar223 = fVar255 * fVar235 - fVar235 * fVar255;
  fVar137 = fVar246 * fVar247 - fVar254 * fVar245;
  fVar151 = fVar253 * fVar254 - fVar256 * fVar246;
  fVar189 = fVar245 * fVar256 - fVar247 * fVar253;
  fVar116 = fVar187 * fVar152 - fVar179 * fVar181;
  fVar130 = fVar188 * fVar179 - fVar180 * fVar187;
  fVar135 = fVar181 * fVar180 - fVar152 * fVar188;
  fVar136 = fVar198 * fVar199 - fVar199 * fVar198;
  fVar95 = fVar187 * fVar129 - fVar53 * fVar181;
  fVar53 = fVar188 * fVar53 - fVar93 * fVar187;
  fVar93 = fVar181 * fVar93 - fVar129 * fVar188;
  fVar180 = fVar222 * fVar222 + fVar214 * fVar214 + fVar212 * fVar212;
  auVar203 = ZEXT416((uint)fVar180);
  auVar61 = rsqrtss(ZEXT416((uint)fVar180),auVar203);
  fVar129 = auVar61._0_4_;
  fVar199 = fVar129 * 1.5 - fVar129 * fVar129 * fVar180 * 0.5 * fVar129;
  fVar213 = fVar212 * fVar137 + fVar222 * fVar189 + fVar214 * fVar151;
  fVar129 = fVar223 * fVar199;
  auVar61 = rcpss(auVar203,auVar203);
  fVar150 = (2.0 - fVar180 * auVar61._0_4_) * auVar61._0_4_;
  fVar152 = fVar135 * fVar135 + fVar130 * fVar130 + fVar116 * fVar116;
  auVar61 = ZEXT416((uint)fVar152);
  auVar203 = rsqrtss(ZEXT416((uint)fVar152),auVar61);
  fVar114 = auVar203._0_4_;
  fVar128 = fVar114 * 1.5 - fVar114 * fVar114 * fVar152 * 0.5 * fVar114;
  fVar200 = fVar116 * fVar95 + fVar135 * fVar93 + fVar130 * fVar53;
  fVar115 = fVar136 * fVar128;
  auVar61 = rcpss(auVar61,auVar61);
  fVar114 = (2.0 - fVar152 * auVar61._0_4_) * auVar61._0_4_;
  local_358 = fVar244 * fVar214 * fVar199;
  fStack_354 = fVar244 * fVar222 * fVar199;
  fStack_350 = fVar244 * fVar212 * fVar199;
  fStack_34c = fVar244 * fVar129;
  local_368 = fVar233 - local_358;
  fStack_364 = fVar236 - fStack_354;
  fStack_360 = fVar243 - fStack_350;
  fStack_35c = fVar244 - fStack_34c;
  fVar151 = fVar244 * fVar150 * (fVar180 * fVar151 - fVar213 * fVar214) * fVar199 +
            fVar255 * fVar214 * fVar199;
  fVar189 = fVar244 * fVar150 * (fVar180 * fVar189 - fVar213 * fVar222) * fVar199 +
            fVar255 * fVar222 * fVar199;
  fVar179 = fVar244 * fVar150 * (fVar180 * fVar137 - fVar213 * fVar212) * fVar199 +
            fVar255 * fVar212 * fVar199;
  fVar150 = fVar244 * fVar150 * (fVar180 * (fVar255 * fVar258 - fVar258 * fVar255) -
                                fVar213 * fVar223) * fVar199 + fVar255 * fVar129;
  local_358 = local_358 + fVar233;
  fStack_354 = fStack_354 + fVar236;
  fStack_350 = fStack_350 + fVar243;
  fStack_34c = fStack_34c + fVar244;
  fVar137 = fVar264 * fVar130 * fVar128;
  fStack_3c4 = fVar264 * fVar135 * fVar128;
  fStack_3c0 = fVar264 * fVar116 * fVar128;
  fStack_3bc = fVar264 * fVar115;
  local_388 = fVar257 - fVar137;
  fStack_384 = fVar259 - fStack_3c4;
  fStack_380 = fVar263 - fStack_3c0;
  fStack_37c = fVar264 - fStack_3bc;
  fVar129 = fVar264 * fVar114 * (fVar152 * fVar53 - fVar200 * fVar130) * fVar128 +
            fVar198 * fVar130 * fVar128;
  fVar53 = fVar264 * fVar114 * (fVar152 * fVar93 - fVar200 * fVar135) * fVar128 +
           fVar198 * fVar135 * fVar128;
  fVar93 = fVar264 * fVar114 * (fVar152 * fVar95 - fVar200 * fVar116) * fVar128 +
           fVar198 * fVar116 * fVar128;
  fVar94 = fVar264 * fVar114 * (fVar152 * (fVar198 * fVar94 - fVar94 * fVar198) - fVar200 * fVar136)
                     * fVar128 + fVar198 * fVar115;
  local_3d4.m128[3] = fVar137 + fVar257;
  fStack_3c4 = fStack_3c4 + fVar259;
  fStack_3c0 = fStack_3c0 + fVar263;
  fStack_3bc = fStack_3bc + fVar264;
  local_378 = (fVar245 - fVar151) * 0.33333334 + local_368;
  fStack_374 = (fVar246 - fVar189) * 0.33333334 + fStack_364;
  fStack_370 = (fVar253 - fVar179) * 0.33333334 + fStack_360;
  fStack_36c = (fVar255 - fVar150) * 0.33333334 + fStack_35c;
  local_398 = local_388 - (fVar181 - fVar129) * 0.33333334;
  fStack_394 = fStack_384 - (fVar187 - fVar53) * 0.33333334;
  fStack_390 = fStack_380 - (fVar188 - fVar93) * 0.33333334;
  fStack_38c = fStack_37c - (fVar198 - fVar94) * 0.33333334;
  local_3a8 = local_3d4.m128[3] - (fVar129 + fVar181) * 0.33333334;
  fStack_3a4 = fStack_3c4 - (fVar53 + fVar187) * 0.33333334;
  fStack_3a0 = fStack_3c0 - (fVar93 + fVar188) * 0.33333334;
  fStack_39c = fStack_3bc - (fVar94 + fVar198) * 0.33333334;
  fVar129 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar53 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar93 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar94 = (pre->ray_space).vx.field_0.m128[0];
  fVar95 = (pre->ray_space).vx.field_0.m128[1];
  fVar114 = (pre->ray_space).vy.field_0.m128[0];
  fVar115 = (pre->ray_space).vy.field_0.m128[1];
  fVar116 = (pre->ray_space).vz.field_0.m128[0];
  fVar128 = (pre->ray_space).vz.field_0.m128[1];
  fVar188 = (local_368 - fVar129) * fVar94 +
            (fStack_364 - fVar53) * fVar114 + (fStack_360 - fVar93) * fVar116;
  fVar198 = (local_368 - fVar129) * fVar95 +
            (fStack_364 - fVar53) * fVar115 + (fStack_360 - fVar93) * fVar128;
  local_2d8 = CONCAT44(fVar198,fVar188);
  fVar181 = (local_378 - fVar129) * fVar94 +
            (fStack_374 - fVar53) * fVar114 + (fStack_370 - fVar93) * fVar116;
  fVar187 = (local_378 - fVar129) * fVar95 +
            (fStack_374 - fVar53) * fVar115 + (fStack_370 - fVar93) * fVar128;
  uVar248 = CONCAT44(fVar187,fVar181);
  fVar136 = (local_398 - fVar129) * fVar94 +
            (fStack_394 - fVar53) * fVar114 + (fStack_390 - fVar93) * fVar116;
  fVar137 = (local_398 - fVar129) * fVar95 +
            (fStack_394 - fVar53) * fVar115 + (fStack_390 - fVar93) * fVar128;
  local_2c8 = CONCAT44(fVar137,fVar136);
  fVar130 = (local_388 - fVar129) * fVar94 +
            (fStack_384 - fVar53) * fVar114 + (fStack_380 - fVar93) * fVar116;
  fVar135 = (local_388 - fVar129) * fVar95 +
            (fStack_384 - fVar53) * fVar115 + (fStack_380 - fVar93) * fVar128;
  uVar96 = CONCAT44(fVar135,fVar130);
  fStack_298 = (local_358 - fVar129) * fVar94 +
               (fStack_354 - fVar53) * fVar114 + (fStack_350 - fVar93) * fVar116;
  fStack_294 = (local_358 - fVar129) * fVar95 +
               (fStack_354 - fVar53) * fVar115 + (fStack_350 - fVar93) * fVar128;
  local_218 = (fVar151 + fVar245) * 0.33333334 + local_358;
  fStack_214 = (fVar189 + fVar246) * 0.33333334 + fStack_354;
  fStack_210 = (fVar179 + fVar253) * 0.33333334 + fStack_350;
  fStack_20c = (fVar150 + fVar255) * 0.33333334 + fStack_34c;
  fVar150 = (local_218 - fVar129) * fVar94 +
            (fStack_214 - fVar53) * fVar114 + (fStack_210 - fVar93) * fVar116;
  fVar151 = (local_218 - fVar129) * fVar95 +
            (fStack_214 - fVar53) * fVar115 + (fStack_210 - fVar93) * fVar128;
  local_328._0_8_ = CONCAT44(fVar151,fVar150);
  local_2b8 = (local_3a8 - fVar129) * fVar94 +
              (fStack_3a4 - fVar53) * fVar114 + (fStack_3a0 - fVar93) * fVar116;
  fStack_2b4 = (local_3a8 - fVar129) * fVar95 +
               (fStack_3a4 - fVar53) * fVar115 + (fStack_3a0 - fVar93) * fVar128;
  local_348 = (local_3d4.m128[3] - fVar129) * fVar94 +
              (fStack_3c4 - fVar53) * fVar114 + (fStack_3c0 - fVar93) * fVar116;
  fStack_344 = (local_3d4.m128[3] - fVar129) * fVar95 +
               (fStack_3c4 - fVar53) * fVar115 + (fStack_3c0 - fVar93) * fVar128;
  local_b8._12_4_ = fStack_344;
  local_b8._8_4_ = local_348;
  auVar238._8_8_ = local_328._0_8_;
  auVar238._0_8_ = uVar248;
  local_b8._0_8_ = uVar96;
  auVar78._8_4_ = fStack_298;
  auVar78._0_8_ = local_2d8;
  auVar78._12_4_ = fStack_294;
  auVar61 = minps(auVar78,auVar238);
  auVar100._8_4_ = local_2b8;
  auVar100._0_8_ = local_2c8;
  auVar100._12_4_ = fStack_2b4;
  auVar203 = minps(auVar100,local_b8);
  auVar61 = minps(auVar61,auVar203);
  auVar101._4_4_ = fVar198;
  auVar101._0_4_ = fVar188;
  auVar101._8_4_ = fStack_298;
  auVar101._12_4_ = fStack_294;
  auVar203 = maxps(auVar101,auVar238);
  auVar119._4_4_ = fVar137;
  auVar119._0_4_ = fVar136;
  auVar119._8_4_ = local_2b8;
  auVar119._12_4_ = fStack_2b4;
  auVar120 = maxps(auVar119,local_b8);
  auVar102 = maxps(auVar203,auVar120);
  auVar13._4_8_ = auVar120._8_8_;
  auVar13._0_4_ = auVar61._4_4_;
  auVar121._0_8_ = auVar13._0_8_ << 0x20;
  auVar121._8_4_ = auVar61._8_4_;
  auVar121._12_4_ = auVar61._12_4_;
  auVar122._8_8_ = auVar61._8_8_;
  auVar122._0_8_ = auVar121._8_8_;
  auVar203 = minps(auVar61,auVar122);
  auVar14._4_8_ = auVar61._8_8_;
  auVar14._0_4_ = auVar102._4_4_;
  auVar123._0_8_ = auVar14._0_8_ << 0x20;
  auVar123._8_4_ = auVar102._8_4_;
  auVar123._12_4_ = auVar102._12_4_;
  auVar124._8_8_ = auVar102._8_8_;
  auVar124._0_8_ = auVar123._8_8_;
  auVar61 = maxps(auVar102,auVar124);
  auVar79._0_8_ = auVar203._0_8_ & 0x7fffffff7fffffff;
  auVar79._8_4_ = auVar203._8_4_ & 0x7fffffff;
  auVar79._12_4_ = auVar203._12_4_ & 0x7fffffff;
  auVar103._0_8_ = auVar61._0_8_ & 0x7fffffff7fffffff;
  auVar103._8_4_ = auVar61._8_4_ & 0x7fffffff;
  auVar103._12_4_ = auVar61._12_4_ & 0x7fffffff;
  auVar61 = maxps(auVar79,auVar103);
  fStack_c4 = auVar61._4_4_;
  local_c8 = fStack_c4;
  if (fStack_c4 <= auVar61._0_4_) {
    local_c8 = auVar61._0_4_;
  }
  local_c8 = local_c8 * 9.536743e-07;
  register0x000015c8 = local_2d8;
  register0x00001388 = uVar248;
  local_2e8 = uVar248;
  register0x00001308 = local_2c8;
  local_2f8 = local_2c8;
  register0x00001548 = uVar96;
  local_308 = uVar96;
  local_328._8_8_ = local_328._0_8_;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  local_2a8 = local_2d8;
  local_88 = fVar181 - fVar188;
  fStack_84 = fVar187 - fVar198;
  fStack_80 = fVar150 - fStack_298;
  fStack_7c = fVar151 - fStack_294;
  local_98 = fVar136 - fVar181;
  fStack_94 = fVar137 - fVar187;
  fStack_90 = local_2b8 - fVar150;
  fStack_8c = fStack_2b4 - fVar151;
  uStack_2b0 = local_328._0_8_;
  local_a8 = fVar130 - fVar136;
  fStack_a4 = fVar135 - fVar137;
  fStack_a0 = local_348 - local_2b8;
  fStack_9c = fStack_344 - fStack_2b4;
  local_188 = local_358 - local_368;
  fStack_184 = fStack_354 - fStack_364;
  fStack_180 = fStack_350 - fStack_360;
  fStack_17c = fStack_34c - fStack_35c;
  local_198 = local_218 - local_378;
  fStack_194 = fStack_214 - fStack_374;
  fStack_190 = fStack_210 - fStack_370;
  fStack_18c = fStack_20c - fStack_36c;
  local_1a8 = local_3a8 - local_398;
  fStack_1a4 = fStack_3a4 - fStack_394;
  fStack_1a0 = fStack_3a0 - fStack_390;
  fStack_19c = fStack_39c - fStack_38c;
  local_1b8 = local_3d4.m128[3] - local_388;
  fStack_1b4 = fStack_3c4 - fStack_384;
  fStack_1b0 = fStack_3c0 - fStack_380;
  fStack_1ac = fStack_3bc - fStack_37c;
  uVar44 = 0;
  fVar129 = 0.0;
  fVar53 = 1.0;
  fVar95 = 0.0;
  fVar114 = 0.0;
  fVar93 = 0.0;
  fVar94 = 1.0;
  local_158 = local_c8;
  fStack_154 = local_c8;
  fStack_150 = local_c8;
  fStack_14c = local_c8;
  local_168 = -local_c8;
  fStack_164 = -local_c8;
  fStack_160 = -local_c8;
  fStack_15c = -local_c8;
  local_318 = fStack_298;
  fStack_314 = fStack_294;
  fStack_310 = fStack_298;
  fStack_30c = fStack_294;
  local_338 = local_2b8;
  fStack_334 = fStack_2b4;
  fStack_330 = local_2b8;
  fStack_32c = fStack_2b4;
  fStack_340 = local_348;
  fStack_33c = fStack_344;
LAB_0030af59:
  fVar115 = 1.0 - fVar129;
  fVar116 = 1.0 - fVar129;
  fVar128 = 1.0 - fVar53;
  fVar130 = 1.0 - fVar53;
  fVar180 = local_2d8._0_4_ * fVar115 + local_318 * fVar129;
  fVar222 = local_2d8._4_4_ * fVar116 + fStack_314 * fVar129;
  fVar223 = local_2d8._8_4_ * fVar128 + fStack_310 * fVar53;
  fVar236 = local_2d8._12_4_ * fVar130 + fStack_30c * fVar53;
  fVar150 = local_2e8._0_4_ * fVar115 + local_328._0_4_ * fVar129;
  fVar212 = local_2e8._4_4_ * fVar116 + local_328._4_4_ * fVar129;
  fVar213 = local_2e8._8_4_ * fVar128 + local_328._8_4_ * fVar53;
  fVar214 = local_2e8._12_4_ * fVar130 + local_328._12_4_ * fVar53;
  fVar233 = local_2f8._0_4_ * fVar115 + local_338 * fVar129;
  fVar259 = local_2f8._4_4_ * fVar116 + fStack_334 * fVar129;
  fVar263 = local_2f8._8_4_ * fVar128 + fStack_330 * fVar53;
  fVar264 = local_2f8._12_4_ * fVar130 + fStack_32c * fVar53;
  fVar224 = fVar115 * local_308._0_4_ + fVar129 * local_348;
  fVar231 = fVar116 * local_308._4_4_ + fVar129 * fStack_344;
  fVar243 = fVar128 * local_308._8_4_ + fVar53 * fStack_340;
  fVar244 = fVar130 * local_308._12_4_ + fVar53 * fStack_33c;
  fVar245 = (fVar94 - fVar93) * 0.11111111;
  fVar246 = (fVar94 - fVar93) * 0.0 + fVar93;
  fVar253 = (fVar94 - fVar93) * 0.33333334 + fVar93;
  fVar255 = (fVar94 - fVar93) * 0.6666667 + fVar93;
  fVar257 = (fVar94 - fVar93) * 1.0 + fVar93;
  fVar115 = 1.0 - fVar246;
  fVar116 = 1.0 - fVar253;
  fVar128 = 1.0 - fVar255;
  fVar130 = 1.0 - fVar257;
  fVar151 = fVar150 * fVar115 + fVar233 * fVar246;
  fVar189 = fVar150 * fVar116 + fVar233 * fVar253;
  fVar181 = fVar150 * fVar128 + fVar233 * fVar255;
  fVar187 = fVar150 * fVar130 + fVar233 * fVar257;
  fVar188 = fVar212 * fVar115 + fVar259 * fVar246;
  fVar198 = fVar212 * fVar116 + fVar259 * fVar253;
  fVar152 = fVar212 * fVar128 + fVar259 * fVar255;
  fVar179 = fVar212 * fVar130 + fVar259 * fVar257;
  fVar135 = (fVar180 * fVar115 + fVar150 * fVar246) * fVar115 + fVar246 * fVar151;
  fVar136 = (fVar180 * fVar116 + fVar150 * fVar253) * fVar116 + fVar253 * fVar189;
  fVar137 = (fVar180 * fVar128 + fVar150 * fVar255) * fVar128 + fVar255 * fVar181;
  fVar150 = (fVar180 * fVar130 + fVar150 * fVar257) * fVar130 + fVar257 * fVar187;
  fVar180 = (fVar222 * fVar115 + fVar212 * fVar246) * fVar115 + fVar246 * fVar188;
  fVar199 = (fVar222 * fVar116 + fVar212 * fVar253) * fVar116 + fVar253 * fVar198;
  fVar200 = (fVar222 * fVar128 + fVar212 * fVar255) * fVar128 + fVar255 * fVar152;
  fVar212 = (fVar222 * fVar130 + fVar212 * fVar257) * fVar130 + fVar257 * fVar179;
  fVar151 = fVar151 * fVar115 + (fVar233 * fVar115 + fVar224 * fVar246) * fVar246;
  fVar189 = fVar189 * fVar116 + (fVar233 * fVar116 + fVar224 * fVar253) * fVar253;
  fVar181 = fVar181 * fVar128 + (fVar233 * fVar128 + fVar224 * fVar255) * fVar255;
  fVar187 = fVar187 * fVar130 + (fVar233 * fVar130 + fVar224 * fVar257) * fVar257;
  fVar188 = fVar188 * fVar115 + (fVar259 * fVar115 + fVar231 * fVar246) * fVar246;
  fVar198 = fVar198 * fVar116 + (fVar259 * fVar116 + fVar231 * fVar253) * fVar253;
  fVar152 = fVar152 * fVar128 + (fVar259 * fVar128 + fVar231 * fVar255) * fVar255;
  fVar179 = fVar179 * fVar130 + (fVar259 * fVar130 + fVar231 * fVar257) * fVar257;
  local_258 = fVar115 * fVar135 + fVar246 * fVar151;
  fStack_254 = fVar116 * fVar136 + fVar253 * fVar189;
  fStack_250 = fVar128 * fVar137 + fVar255 * fVar181;
  fStack_24c = fVar130 * fVar150 + fVar257 * fVar187;
  local_148 = fVar115 * fVar180 + fVar246 * fVar188;
  fStack_144 = fVar116 * fVar199 + fVar253 * fVar198;
  fStack_140 = fVar128 * fVar200 + fVar255 * fVar152;
  fStack_13c = fVar130 * fVar212 + fVar257 * fVar179;
  fVar136 = (fVar189 - fVar136) * 3.0 * fVar245;
  fVar137 = (fVar181 - fVar137) * 3.0 * fVar245;
  fVar150 = (fVar187 - fVar150) * 3.0 * fVar245;
  fVar189 = (fVar198 - fVar199) * 3.0 * fVar245;
  fVar181 = (fVar152 - fVar200) * 3.0 * fVar245;
  fVar187 = (fVar179 - fVar212) * 3.0 * fVar245;
  local_228._4_4_ = fStack_250;
  local_228._0_4_ = fStack_254;
  local_228._8_4_ = fStack_24c;
  local_228._12_4_ = 0;
  local_e8._4_4_ = fStack_140;
  local_e8._0_4_ = fStack_144;
  local_238 = local_258 + (fVar151 - fVar135) * 3.0 * fVar245;
  fStack_234 = fStack_254 + fVar136;
  fStack_230 = fStack_250 + fVar137;
  fStack_22c = fStack_24c + fVar150;
  local_3b8._0_4_ = local_148 + (fVar188 - fVar180) * 3.0 * fVar245;
  local_3b8._4_4_ = fStack_144 + fVar189;
  fStack_3b0 = fStack_140 + fVar181;
  fStack_3ac = fStack_13c + fVar187;
  local_248._0_4_ = fStack_254 - fVar136;
  local_248._4_4_ = fStack_250 - fVar137;
  local_248._8_4_ = fStack_24c - fVar150;
  local_248._12_4_ = 0;
  local_418._0_4_ = fStack_144 - fVar189;
  local_418._4_4_ = fStack_140 - fVar181;
  fStack_410 = fStack_13c - fVar187;
  fStack_40c = 0.0;
  fVar135 = fVar213 * fVar115 + fVar263 * fVar246;
  fVar136 = fVar213 * fVar116 + fVar263 * fVar253;
  fVar137 = fVar213 * fVar128 + fVar263 * fVar255;
  fVar150 = fVar213 * fVar130 + fVar263 * fVar257;
  fVar151 = fVar214 * fVar115 + fVar264 * fVar246;
  fVar189 = fVar214 * fVar116 + fVar264 * fVar253;
  fVar181 = fVar214 * fVar128 + fVar264 * fVar255;
  fVar187 = fVar214 * fVar130 + fVar264 * fVar257;
  fVar188 = (fVar223 * fVar115 + fVar213 * fVar246) * fVar115 + fVar246 * fVar135;
  fVar198 = (fVar223 * fVar116 + fVar213 * fVar253) * fVar116 + fVar253 * fVar136;
  fVar152 = (fVar223 * fVar128 + fVar213 * fVar255) * fVar128 + fVar255 * fVar137;
  fVar179 = (fVar223 * fVar130 + fVar213 * fVar257) * fVar130 + fVar257 * fVar150;
  fVar224 = (fVar236 * fVar115 + fVar214 * fVar246) * fVar115 + fVar246 * fVar151;
  fVar231 = (fVar236 * fVar116 + fVar214 * fVar253) * fVar116 + fVar253 * fVar189;
  fVar233 = (fVar236 * fVar128 + fVar214 * fVar255) * fVar128 + fVar255 * fVar181;
  fVar236 = (fVar236 * fVar130 + fVar214 * fVar257) * fVar130 + fVar257 * fVar187;
  fVar180 = fVar135 * fVar115 + (fVar263 * fVar115 + fVar243 * fVar246) * fVar246;
  fVar199 = fVar136 * fVar116 + (fVar263 * fVar116 + fVar243 * fVar253) * fVar253;
  fVar200 = fVar137 * fVar128 + (fVar263 * fVar128 + fVar243 * fVar255) * fVar255;
  fVar212 = fVar150 * fVar130 + (fVar263 * fVar130 + fVar243 * fVar257) * fVar257;
  fVar213 = fVar151 * fVar115 + (fVar264 * fVar115 + fVar244 * fVar246) * fVar246;
  fVar214 = fVar189 * fVar116 + (fVar264 * fVar116 + fVar244 * fVar253) * fVar253;
  fVar222 = fVar181 * fVar128 + (fVar264 * fVar128 + fVar244 * fVar255) * fVar255;
  fVar223 = fVar187 * fVar130 + (fVar264 * fVar130 + fVar244 * fVar257) * fVar257;
  fVar151 = fVar115 * fVar188 + fVar246 * fVar180;
  fVar189 = fVar116 * fVar198 + fVar253 * fVar199;
  fVar181 = fVar128 * fVar152 + fVar255 * fVar200;
  fVar187 = fVar130 * fVar179 + fVar257 * fVar212;
  fVar135 = fVar115 * fVar224 + fVar246 * fVar213;
  fVar136 = fVar116 * fVar231 + fVar253 * fVar214;
  fVar137 = fVar128 * fVar233 + fVar255 * fVar222;
  fVar150 = fVar130 * fVar236 + fVar257 * fVar223;
  fVar115 = (fVar199 - fVar198) * 3.0 * fVar245;
  fVar116 = (fVar200 - fVar152) * 3.0 * fVar245;
  fVar128 = (fVar212 - fVar179) * 3.0 * fVar245;
  fVar130 = (fVar214 - fVar231) * 3.0 * fVar245;
  fVar198 = (fVar222 - fVar233) * 3.0 * fVar245;
  fVar152 = (fVar223 - fVar236) * 3.0 * fVar245;
  local_f8._4_4_ = fVar181;
  local_f8._0_4_ = fVar189;
  local_f8._8_4_ = fVar187;
  local_f8._12_4_ = 0;
  local_118._4_4_ = fVar137;
  local_118._0_4_ = fVar136;
  local_118._8_4_ = fVar150;
  local_118._12_4_ = 0;
  local_138 = fVar151 + (fVar180 - fVar188) * 3.0 * fVar245;
  fStack_134 = fVar189 + fVar115;
  fStack_130 = fVar181 + fVar116;
  fStack_12c = fVar187 + fVar128;
  local_108 = fVar135 + (fVar213 - fVar224) * 3.0 * fVar245;
  fStack_104 = fVar136 + fVar130;
  fStack_100 = fVar137 + fVar198;
  fStack_fc = fVar150 + fVar152;
  local_d8._0_4_ = fVar189 - fVar115;
  local_d8._4_4_ = fVar181 - fVar116;
  local_d8._8_4_ = fVar187 - fVar128;
  local_d8._12_4_ = 0;
  local_128._0_4_ = fVar136 - fVar130;
  local_128._4_4_ = fVar137 - fVar198;
  local_128._8_4_ = fVar150 - fVar152;
  local_128._12_4_ = 0;
  fVar115 = (fVar189 - fStack_254) + (fVar151 - local_258);
  fVar116 = (fVar181 - fStack_250) + (fVar189 - fStack_254);
  fVar128 = (fVar187 - fStack_24c) + (fVar181 - fStack_250);
  fVar130 = (fVar187 - fStack_24c) + 0.0;
  local_e8._8_4_ = fStack_13c;
  local_e8._12_4_ = 0;
  fVar188 = (fVar136 - fStack_144) + (fVar135 - local_148);
  fVar198 = (fVar137 - fStack_140) + (fVar136 - fStack_144);
  fVar152 = (fVar150 - fStack_13c) + (fVar137 - fStack_140);
  fVar179 = (fVar150 - fStack_13c) + 0.0;
  auVar191._0_8_ =
       CONCAT44(fStack_144 * fVar116 - fStack_254 * fVar198,
                local_148 * fVar115 - local_258 * fVar188);
  auVar191._8_4_ = fStack_140 * fVar128 - fStack_250 * fVar152;
  auVar191._12_4_ = fStack_13c * fVar130 - fStack_24c * fVar179;
  auVar140._0_4_ = (float)local_3b8._0_4_ * fVar115 - local_238 * fVar188;
  auVar140._4_4_ = (float)local_3b8._4_4_ * fVar116 - fStack_234 * fVar198;
  auVar140._8_4_ = fStack_3b0 * fVar128 - fStack_230 * fVar152;
  auVar140._12_4_ = fStack_3ac * fVar130 - fStack_22c * fVar179;
  auVar170._0_8_ =
       CONCAT44((float)local_418._4_4_ * fVar116 - fVar198 * local_248._4_4_,
                (float)local_418._0_4_ * fVar115 - fVar188 * local_248._0_4_);
  auVar170._8_4_ = fStack_410 * fVar128 - fVar152 * local_248._8_4_;
  auVar170._12_4_ = fVar130 * 0.0 - fVar179 * 0.0;
  auVar250._0_4_ = fVar115 * fStack_144 - fVar188 * fStack_254;
  auVar250._4_4_ = fVar116 * fStack_140 - fVar198 * fStack_250;
  auVar250._8_4_ = fVar128 * fStack_13c - fVar152 * fStack_24c;
  auVar250._12_4_ = fVar130 * 0.0 - fVar179 * 0.0;
  auVar215._0_8_ =
       CONCAT44(fVar136 * fVar116 - fVar189 * fVar198,fVar135 * fVar115 - fVar151 * fVar188);
  auVar215._8_4_ = fVar137 * fVar128 - fVar181 * fVar152;
  auVar215._12_4_ = fVar150 * fVar130 - fVar187 * fVar179;
  auVar262._0_4_ = local_108 * fVar115 - local_138 * fVar188;
  auVar262._4_4_ = fStack_104 * fVar116 - fStack_134 * fVar198;
  auVar262._8_4_ = fStack_100 * fVar128 - fStack_130 * fVar152;
  auVar262._12_4_ = fStack_fc * fVar130 - fStack_12c * fVar179;
  auVar204._0_8_ =
       CONCAT44(local_128._4_4_ * fVar116 - fVar198 * local_d8._4_4_,
                local_128._0_4_ * fVar115 - fVar188 * local_d8._0_4_);
  auVar204._8_4_ = local_128._8_4_ * fVar128 - fVar152 * local_d8._8_4_;
  auVar204._12_4_ = fVar130 * 0.0 - fVar179 * 0.0;
  auVar82._0_4_ = fVar115 * fVar136 - fVar188 * fVar189;
  auVar82._4_4_ = fVar116 * fVar137 - fVar198 * fVar181;
  auVar82._8_4_ = fVar128 * fVar150 - fVar152 * fVar187;
  auVar82._12_4_ = fVar130 * 0.0 - fVar179 * 0.0;
  auVar104._8_4_ = auVar191._8_4_;
  auVar104._0_8_ = auVar191._0_8_;
  auVar104._12_4_ = auVar191._12_4_;
  auVar61 = minps(auVar104,auVar140);
  auVar102 = maxps(auVar191,auVar140);
  auVar141._8_4_ = auVar170._8_4_;
  auVar141._0_8_ = auVar170._0_8_;
  auVar141._12_4_ = auVar170._12_4_;
  auVar203 = minps(auVar141,auVar250);
  auVar61 = minps(auVar61,auVar203);
  auVar203 = maxps(auVar170,auVar250);
  auVar120 = maxps(auVar102,auVar203);
  auVar142._8_4_ = auVar215._8_4_;
  auVar142._0_8_ = auVar215._0_8_;
  auVar142._12_4_ = auVar215._12_4_;
  auVar203 = minps(auVar142,auVar262);
  auVar216 = maxps(auVar215,auVar262);
  auVar171._8_4_ = auVar204._8_4_;
  auVar171._0_8_ = auVar204._0_8_;
  auVar171._12_4_ = auVar204._12_4_;
  auVar102 = minps(auVar171,auVar82);
  auVar203 = minps(auVar203,auVar102);
  auVar61 = minps(auVar61,auVar203);
  auVar203 = maxps(auVar204,auVar82);
  auVar203 = maxps(auVar216,auVar203);
  auVar203 = maxps(auVar120,auVar203);
  bVar45 = auVar61._4_4_ <= fStack_154;
  bVar11 = auVar61._8_4_ <= fStack_150;
  bVar12 = auVar61._12_4_ <= fStack_14c;
  auVar38._4_4_ = -(uint)bVar11;
  auVar38._0_4_ = -(uint)bVar45;
  auVar38._8_4_ = -(uint)bVar12;
  auVar38._12_4_ = 0;
  auVar108 = auVar38 << 0x20;
  auVar192._0_4_ =
       -(uint)(local_168 <= auVar203._0_4_ && auVar61._0_4_ <= local_158) & local_178._0_4_;
  auVar192._4_4_ = -(uint)(fStack_164 <= auVar203._4_4_ && bVar45) & local_178._4_4_;
  auVar192._8_4_ = -(uint)(fStack_160 <= auVar203._8_4_ && bVar11) & local_178._8_4_;
  auVar192._12_4_ = -(uint)(fStack_15c <= auVar203._12_4_ && bVar12) & local_178._12_4_;
  uVar48 = movmskps((int)uVar42,auVar192);
  local_288.ray = (RTCRayN *)(ulong)uVar48;
  if (uVar48 != 0) {
    fVar115 = (fVar189 - fVar151) + (fStack_254 - local_258);
    fVar116 = (fVar181 - fVar189) + (fStack_250 - fStack_254);
    fVar128 = (fVar187 - fVar181) + (fStack_24c - fStack_250);
    fVar130 = (0.0 - fVar187) + (0.0 - fStack_24c);
    fVar188 = (fVar136 - fVar135) + (fStack_144 - local_148);
    fVar198 = (fVar137 - fVar136) + (fStack_140 - fStack_144);
    fVar152 = (fVar150 - fVar137) + (fStack_13c - fStack_140);
    fVar179 = (0.0 - fVar150) + (0.0 - fStack_13c);
    auVar265._0_8_ =
         CONCAT44(fStack_144 * fVar116 - fStack_254 * fVar198,
                  local_148 * fVar115 - local_258 * fVar188);
    auVar265._8_4_ = fStack_140 * fVar128 - fStack_250 * fVar152;
    auVar265._12_4_ = fStack_13c * fVar130 - fStack_24c * fVar179;
    auVar143._0_4_ = (float)local_3b8._0_4_ * fVar115 - local_238 * fVar188;
    auVar143._4_4_ = (float)local_3b8._4_4_ * fVar116 - fStack_234 * fVar198;
    auVar143._8_4_ = fStack_3b0 * fVar128 - fStack_230 * fVar152;
    auVar143._12_4_ = fStack_3ac * fVar130 - fStack_22c * fVar179;
    auVar205._0_8_ =
         CONCAT44((float)local_418._4_4_ * fVar116 - local_248._4_4_ * fVar198,
                  (float)local_418._0_4_ * fVar115 - local_248._0_4_ * fVar188);
    auVar205._8_4_ = fStack_410 * fVar128 - local_248._8_4_ * fVar152;
    auVar205._12_4_ = fVar130 * 0.0 - fVar179 * 0.0;
    auVar172._0_4_ = fStack_144 * fVar115 - fStack_254 * fVar188;
    auVar172._4_4_ = fStack_140 * fVar116 - fStack_250 * fVar198;
    auVar172._8_4_ = fStack_13c * fVar128 - fStack_24c * fVar152;
    auVar172._12_4_ = fVar130 * 0.0 - fVar179 * 0.0;
    auVar125._0_8_ =
         CONCAT44(fVar136 * fVar116 - fVar189 * fVar198,fVar135 * fVar115 - fVar151 * fVar188);
    auVar125._8_4_ = fVar137 * fVar128 - fVar181 * fVar152;
    auVar125._12_4_ = fVar150 * fVar130 - fVar187 * fVar179;
    auVar226._0_4_ = local_108 * fVar115 - local_138 * fVar188;
    auVar226._4_4_ = fStack_104 * fVar116 - fStack_134 * fVar198;
    auVar226._8_4_ = fStack_100 * fVar128 - fStack_130 * fVar152;
    auVar226._12_4_ = fStack_fc * fVar130 - fStack_12c * fVar179;
    auVar251._0_8_ =
         CONCAT44(local_128._4_4_ * fVar116 - local_d8._4_4_ * fVar198,
                  local_128._0_4_ * fVar115 - local_d8._0_4_ * fVar188);
    auVar251._8_4_ = local_128._8_4_ * fVar128 - local_d8._8_4_ * fVar152;
    auVar251._12_4_ = fVar130 * 0.0 - fVar179 * 0.0;
    auVar82._0_4_ = fVar115 * fVar136 - fVar188 * fVar189;
    auVar82._4_4_ = fVar116 * fVar137 - fVar198 * fVar181;
    auVar82._8_4_ = fVar128 * fVar150 - fVar152 * fVar187;
    auVar82._12_4_ = fVar130 * 0.0 - fVar179 * 0.0;
    auVar105._8_4_ = auVar265._8_4_;
    auVar105._0_8_ = auVar265._0_8_;
    auVar105._12_4_ = auVar265._12_4_;
    auVar61 = minps(auVar105,auVar143);
    auVar102 = maxps(auVar265,auVar143);
    auVar144._8_4_ = auVar205._8_4_;
    auVar144._0_8_ = auVar205._0_8_;
    auVar144._12_4_ = auVar205._12_4_;
    auVar203 = minps(auVar144,auVar172);
    auVar61 = minps(auVar61,auVar203);
    auVar203 = maxps(auVar205,auVar172);
    auVar216 = maxps(auVar102,auVar203);
    auVar145._8_4_ = auVar125._8_4_;
    auVar145._0_8_ = auVar125._0_8_;
    auVar145._12_4_ = auVar125._12_4_;
    auVar102 = minps(auVar145,auVar226);
    auVar203 = maxps(auVar125,auVar226);
    auVar173._8_4_ = auVar251._8_4_;
    auVar173._0_8_ = auVar251._0_8_;
    auVar173._12_4_ = auVar251._12_4_;
    auVar120 = minps(auVar173,auVar82);
    auVar102 = minps(auVar102,auVar120);
    auVar61 = minps(auVar61,auVar102);
    auVar102 = maxps(auVar251,auVar82);
    auVar203 = maxps(auVar203,auVar102);
    auVar203 = maxps(auVar216,auVar203);
    bVar45 = auVar61._4_4_ <= fStack_154;
    bVar11 = auVar61._8_4_ <= fStack_150;
    bVar12 = auVar61._12_4_ <= fStack_14c;
    auVar39._4_4_ = -(uint)bVar11;
    auVar39._0_4_ = -(uint)bVar45;
    auVar39._8_4_ = -(uint)bVar12;
    auVar39._12_4_ = 0;
    auVar108 = auVar39 << 0x20;
    auVar266._0_4_ =
         -(uint)(local_168 <= auVar203._0_4_ && auVar61._0_4_ <= local_158) & auVar192._0_4_;
    auVar266._4_4_ = -(uint)(fStack_164 <= auVar203._4_4_ && bVar45) & auVar192._4_4_;
    auVar266._8_4_ = -(uint)(fStack_160 <= auVar203._8_4_ && bVar11) & auVar192._8_4_;
    auVar266._12_4_ = -(uint)(fStack_15c <= auVar203._12_4_ && bVar12) & auVar192._12_4_;
    uVar48 = movmskps(uVar48,auVar266);
    local_288.ray = (RTCRayN *)(ulong)uVar48;
    auVar262 = local_118;
    if (uVar48 != 0) {
      local_288.ray = (RTCRayN *)(ulong)(byte)uVar48;
      auStack_208[uVar44] = uVar48 & 0xff;
      *(ulong *)(afStack_78 + uVar44 * 2) = CONCAT44(fVar94,fVar93);
      auVar82._8_4_ = fVar95;
      auVar82._0_8_ = CONCAT44(fVar53,fVar129);
      auVar82._12_4_ = fVar114;
      *(ulong *)(afStack_58 + uVar44 * 2) = CONCAT44(fVar53,fVar129);
      uVar44 = (ulong)((int)uVar44 + 1);
    }
  }
LAB_0030b5b3:
  auVar61 = _local_418;
  if ((int)uVar44 == 0) {
    fVar129 = (ray->super_RayK<1>).tfar;
    auVar113._4_4_ = -(uint)(fStack_1c4 <= fVar129);
    auVar113._0_4_ = -(uint)(local_1c8 <= fVar129);
    auVar113._8_4_ = -(uint)(fStack_1c0 <= fVar129);
    auVar113._12_4_ = -(uint)(fStack_1bc <= fVar129);
    uVar46 = movmskps((int)local_288.ray,auVar113);
    uVar46 = (uint)uVar43 & uVar46;
    context = pRVar40;
    goto LAB_0030a6e1;
  }
  uVar50 = (int)uVar44 - 1;
  uVar42 = (ulong)uVar50;
  uVar48 = auStack_208[uVar42];
  fVar129 = afStack_58[uVar42 * 2];
  fVar53 = afStack_58[uVar42 * 2 + 1];
  fVar95 = 0.0;
  fVar114 = 0.0;
  uVar10 = 0;
  if (uVar48 != 0) {
    for (; (uVar48 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
    }
  }
  uVar48 = uVar48 - 1 & uVar48;
  auStack_208[uVar42] = uVar48;
  if (uVar48 == 0) {
    uVar44 = (ulong)uVar50;
  }
  fVar94 = (float)(uVar10 + 1) * 0.33333334;
  fVar128 = auVar82._4_4_ * 0.0;
  fVar130 = auVar108._4_4_ * 0.0;
  fVar115 = afStack_78[uVar42 * 2];
  fVar116 = afStack_78[uVar42 * 2 + 1];
  fVar93 = fVar115 * (1.0 - (float)uVar10 * 0.33333334) + fVar116 * (float)uVar10 * 0.33333334;
  fVar94 = fVar115 * (1.0 - fVar94) + fVar116 * fVar94;
  fVar128 = fVar115 * (0.0 - fVar128) + fVar116 * fVar128;
  fVar116 = fVar115 * (0.0 - fVar130) + fVar116 * fVar130;
  fVar115 = fVar94 - fVar93;
  if (fVar115 < 0.16666667) {
    fVar189 = 1.0 - fVar129;
    fVar181 = 1.0 - fVar129;
    fVar198 = 1.0 - fVar53;
    fVar152 = 1.0 - fVar53;
    fVar136 = (float)local_2d8._0_4_ * fVar189 + local_318 * fVar129;
    fVar150 = (float)local_2d8._4_4_ * fVar181 + fStack_314 * fVar129;
    fVar95 = fStack_2d0 * fVar198 + fStack_310 * fVar53;
    fVar114 = fStack_2cc * fVar152 + fStack_30c * fVar53;
    fVar130 = (float)local_2e8._0_4_ * fVar189 + local_328._0_4_ * fVar129;
    fVar135 = (float)local_2e8._4_4_ * fVar181 + local_328._4_4_ * fVar129;
    fVar137 = fStack_2e0 * fVar198 + local_328._8_4_ * fVar53;
    fVar151 = fStack_2dc * fVar152 + local_328._12_4_ * fVar53;
    fVar199 = (float)local_2f8._0_4_ * fVar189 + local_338 * fVar129;
    fVar212 = (float)local_2f8._4_4_ * fVar181 + fStack_334 * fVar129;
    fVar214 = fStack_2f0 * fVar198 + fStack_330 * fVar53;
    fVar223 = fStack_2ec * fVar152 + fStack_32c * fVar53;
    fVar187 = (fVar189 * (float)local_308._0_4_ + fVar129 * local_348) - fVar199;
    fVar188 = (fVar181 * (float)local_308._4_4_ + fVar129 * fStack_344) - fVar212;
    fVar179 = (fVar198 * fStack_300 + fVar53 * fStack_340) - fVar214;
    fVar180 = (fVar152 * fStack_2fc + fVar53 * fStack_33c) - fVar223;
    fVar189 = fVar93 * (fVar199 - fVar130) + fVar130;
    fVar181 = fVar93 * (fVar212 - fVar135) + fVar135;
    fVar198 = fVar93 * (fVar214 - fVar137) + fVar137;
    fVar152 = fVar93 * (fVar223 - fVar151) + fVar151;
    fVar200 = (fVar199 - fVar130) * fVar94 + fVar130;
    fVar213 = (fVar212 - fVar135) * fVar94 + fVar135;
    fVar222 = (fVar214 - fVar137) * fVar94 + fVar137;
    fVar224 = (fVar223 - fVar151) * fVar94 + fVar151;
    fVar231 = fVar93 * (fVar130 - fVar136) + fVar136;
    fVar233 = fVar93 * (fVar135 - fVar150) + fVar150;
    fVar236 = fVar93 * (fVar137 - fVar95) + fVar95;
    fVar243 = fVar93 * (fVar151 - fVar114) + fVar114;
    fVar231 = (fVar189 - fVar231) * fVar93 + fVar231;
    fVar233 = (fVar181 - fVar233) * fVar93 + fVar233;
    fVar236 = (fVar198 - fVar236) * fVar93 + fVar236;
    fVar243 = (fVar152 - fVar243) * fVar93 + fVar243;
    fVar189 = (((fVar93 * fVar187 + fVar199) - fVar189) * fVar93 + fVar189) - fVar231;
    fVar181 = (((fVar93 * fVar188 + fVar212) - fVar181) * fVar93 + fVar181) - fVar233;
    fVar198 = (((fVar93 * fVar179 + fVar214) - fVar198) * fVar93 + fVar198) - fVar236;
    fVar152 = (((fVar93 * fVar180 + fVar223) - fVar152) * fVar93 + fVar152) - fVar243;
    auVar126._0_4_ = fVar93 * fVar189 + fVar231;
    auVar126._4_4_ = fVar93 * fVar181 + fVar233;
    auVar126._8_4_ = fVar93 * fVar198 + fVar236;
    auVar126._12_4_ = fVar93 * fVar152 + fVar243;
    fVar136 = (fVar130 - fVar136) * fVar94 + fVar136;
    fVar150 = (fVar135 - fVar150) * fVar94 + fVar150;
    fVar95 = (fVar137 - fVar95) * fVar94 + fVar95;
    fVar114 = (fVar151 - fVar114) * fVar94 + fVar114;
    fVar136 = (fVar200 - fVar136) * fVar94 + fVar136;
    fVar150 = (fVar213 - fVar150) * fVar94 + fVar150;
    fVar95 = (fVar222 - fVar95) * fVar94 + fVar95;
    fVar114 = (fVar224 - fVar114) * fVar94 + fVar114;
    fVar130 = (((fVar187 * fVar94 + fVar199) - fVar200) * fVar94 + fVar200) - fVar136;
    fVar135 = (((fVar188 * fVar94 + fVar212) - fVar213) * fVar94 + fVar213) - fVar150;
    fVar137 = (((fVar179 * fVar94 + fVar214) - fVar222) * fVar94 + fVar222) - fVar95;
    fVar151 = (((fVar180 * fVar94 + fVar223) - fVar224) * fVar94 + fVar224) - fVar114;
    fVar136 = fVar94 * fVar130 + fVar136;
    fVar150 = fVar94 * fVar135 + fVar150;
    fVar93 = fVar94 * fVar137 + fVar95;
    fVar94 = fVar94 * fVar151 + fVar114;
    fVar95 = fVar115 * 0.33333334;
    fVar187 = fVar189 * (float)DAT_01f4afa0 * fVar95 + auVar126._0_4_;
    fVar188 = fVar181 * DAT_01f4afa0._4_4_ * fVar95 + auVar126._4_4_;
    fVar198 = fVar198 * DAT_01f4afa0._8_4_ * fVar95 + auVar126._8_4_;
    fVar152 = fVar152 * DAT_01f4afa0._12_4_ * fVar95 + auVar126._12_4_;
    fVar179 = fVar136 - fVar95 * fVar130 * (float)DAT_01f4afa0;
    fVar180 = fVar150 - fVar95 * fVar135 * DAT_01f4afa0._4_4_;
    fVar199 = fVar93 - fVar95 * fVar137 * DAT_01f4afa0._8_4_;
    fVar200 = fVar94 - fVar95 * fVar151 * DAT_01f4afa0._12_4_;
    auVar15._4_8_ = auVar262._8_8_;
    auVar15._0_4_ = auVar126._4_4_;
    auVar260._0_8_ = auVar15._0_8_ << 0x20;
    auVar260._8_4_ = auVar126._8_4_;
    auVar260._12_4_ = auVar126._12_4_;
    auVar262._8_8_ = auVar126._8_8_;
    auVar262._0_8_ = auVar260._8_8_;
    auVar16._4_8_ = DAT_01f4afa0._8_8_;
    auVar16._0_4_ = fVar150;
    auVar206._0_8_ = auVar16._0_8_ << 0x20;
    auVar206._8_4_ = fVar93;
    auVar206._12_4_ = fVar94;
    fVar137 = (fVar93 - fVar136) + (auVar126._8_4_ - auVar126._0_4_);
    fVar151 = (fVar94 - fVar150) + (auVar126._12_4_ - auVar126._4_4_);
    auVar217._0_4_ = fVar180 * fVar151;
    auVar217._4_4_ = fVar180 * fVar151;
    auVar217._8_4_ = fVar200 * fVar151;
    auVar217._12_4_ = fVar200 * fVar151;
    fVar95 = auVar126._0_4_ * fVar137 + auVar126._4_4_ * fVar151;
    fVar114 = auVar126._8_4_ * fVar137 + auVar126._12_4_ * fVar151;
    fVar189 = fVar187 * fVar137 + fVar188 * fVar151;
    fVar181 = fVar198 * fVar137 + fVar152 * fVar151;
    fVar212 = fVar179 * fVar137 + auVar217._0_4_;
    auVar193._0_8_ = CONCAT44(fVar180 * fVar137 + auVar217._4_4_,fVar212);
    auVar193._8_4_ = fVar199 * fVar137 + auVar217._8_4_;
    auVar193._12_4_ = fVar200 * fVar137 + auVar217._12_4_;
    fVar135 = fVar137 * fVar136 + fVar151 * fVar150;
    fVar213 = fVar137 * fVar93 + fVar151 * fVar94;
    auVar17._4_8_ = auVar217._8_8_;
    auVar17._0_4_ = fVar188 * fVar137 + fVar188 * fVar151;
    auVar218._0_8_ = auVar17._0_8_ << 0x20;
    auVar218._8_4_ = fVar181;
    auVar218._12_4_ = fVar152 * fVar137 + fVar152 * fVar151;
    fVar130 = fVar189;
    if (fVar189 <= fVar95) {
      fVar130 = fVar95;
      fVar95 = fVar189;
    }
    auVar219._8_8_ = auVar218._8_8_;
    auVar219._0_8_ = auVar219._8_8_;
    auVar80._8_4_ = auVar193._8_4_;
    auVar80._0_8_ = auVar193._0_8_;
    auVar80._12_4_ = auVar193._12_4_;
    if (fVar135 <= fVar212) {
      auVar80._0_4_ = fVar135;
    }
    if (auVar80._0_4_ <= fVar95) {
      fVar95 = auVar80._0_4_;
    }
    auVar18._4_8_ = auVar80._8_8_;
    auVar18._0_4_ = fVar137 * fVar150 + fVar151 * fVar150;
    auVar81._0_8_ = auVar18._0_8_ << 0x20;
    auVar81._8_4_ = fVar213;
    auVar81._12_4_ = fVar137 * fVar94 + fVar151 * fVar94;
    if (fVar135 <= fVar212) {
      fVar135 = fVar212;
    }
    auVar82._8_8_ = auVar81._8_8_;
    auVar82._0_8_ = auVar82._8_8_;
    if (fVar135 <= fVar130) {
      fVar135 = fVar130;
    }
    if (fVar181 <= fVar114) {
      auVar219._0_4_ = fVar114;
      fVar114 = fVar181;
    }
    auVar106._8_4_ = auVar193._8_4_;
    auVar106._0_8_ = auVar193._8_8_;
    auVar106._12_4_ = auVar193._12_4_;
    if (fVar213 <= auVar193._8_4_) {
      auVar106._0_4_ = fVar213;
    }
    if (auVar106._0_4_ <= fVar114) {
      fVar114 = auVar106._0_4_;
    }
    if (fVar213 <= auVar193._8_4_) {
      auVar82._0_4_ = auVar193._8_4_;
    }
    if (auVar82._0_4_ <= auVar219._0_4_) {
      auVar82._0_4_ = auVar219._0_4_;
    }
    bVar45 = 3 < (uint)uVar44;
    uVar19 = (undefined3)(uVar50 >> 8);
    local_288.ray = (RTCRayN *)(ulong)CONCAT31(uVar19,bVar45);
    fVar130 = auVar82._0_4_;
    if ((0.0001 <= fVar95) || (fVar130 <= -0.0001)) goto LAB_0030b8d0;
    goto LAB_0030b919;
  }
  goto LAB_0030af59;
LAB_0030b8d0:
  auVar108._0_12_ = ZEXT812(0x38d1b717);
  auVar108._12_4_ = 0.0;
  if ((0.0001 <= fVar114 || fVar135 <= -0.0001) &&
     ((0.0001 <= fVar95 || fVar135 <= -0.0001 && (0.0001 <= fVar114 || fVar130 <= -0.0001))))
  goto LAB_0030b5b3;
LAB_0030b919:
  _local_3b8 = auVar262;
  local_418 = (undefined1  [8])auVar206._8_8_;
  bVar45 = bVar45 || fVar115 < 0.001;
  local_288.ray = (RTCRayN *)(ulong)CONCAT31(uVar19,bVar45);
  fVar151 = (float)(~-(uint)(fVar95 < 0.0) & 0x3f800000 | -(uint)(fVar95 < 0.0) & 0xbf800000);
  fVar189 = (float)(~-(uint)(fVar135 < 0.0) & 0x3f800000 | -(uint)(fVar135 < 0.0) & 0xbf800000);
  fVar137 = 0.0;
  if ((fVar151 == fVar189) && (!NAN(fVar151) && !NAN(fVar189))) {
    fVar137 = INFINITY;
  }
  fVar181 = 0.0;
  if ((fVar151 == fVar189) && (!NAN(fVar151) && !NAN(fVar189))) {
    fVar181 = -INFINITY;
  }
  fVar212 = (float)(~-(uint)(fVar114 < 0.0) & 0x3f800000 | -(uint)(fVar114 < 0.0) & 0xbf800000);
  if ((fVar151 != fVar212) || (fVar213 = fVar181, NAN(fVar151) || NAN(fVar212))) {
    if ((fVar114 != fVar95) || (NAN(fVar114) || NAN(fVar95))) {
      fVar114 = -fVar95 / (fVar114 - fVar95);
      fVar114 = (1.0 - fVar114) * 0.0 + fVar114;
      fVar213 = fVar114;
    }
    else {
      fVar114 = 0.0;
      if ((fVar95 != 0.0) || (fVar213 = 1.0, NAN(fVar95))) {
        fVar114 = INFINITY;
        fVar213 = -INFINITY;
      }
    }
    if (fVar114 <= fVar137) {
      fVar137 = fVar114;
    }
    if (fVar213 <= fVar181) {
      fVar213 = fVar181;
    }
  }
  fVar95 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar130 < 0.0) * 4);
  if ((fVar189 != fVar95) || (fVar114 = fVar213, NAN(fVar189) || NAN(fVar95))) {
    if ((fVar130 != fVar135) || (NAN(fVar130) || NAN(fVar135))) {
      fVar151 = -fVar135 / (fVar130 - fVar135);
      fVar151 = (1.0 - fVar151) * 0.0 + fVar151;
      fVar114 = fVar151;
    }
    else {
      fVar151 = 0.0;
      if ((fVar135 != 0.0) || (fVar114 = 1.0, NAN(fVar135))) {
        fVar151 = INFINITY;
        fVar114 = -INFINITY;
      }
    }
    if (fVar151 <= fVar137) {
      fVar137 = fVar151;
    }
    if (fVar114 <= fVar213) {
      fVar114 = fVar213;
    }
  }
  if ((fVar212 != fVar95) || (NAN(fVar212) || NAN(fVar95))) {
    fVar137 = (float)(~-(uint)(fVar137 < 1.0) & 0x3f800000 | (uint)fVar137 & -(uint)(fVar137 < 1.0))
    ;
    fVar114 = (float)(~-(uint)(fVar114 < 1.0) & (uint)fVar114 | -(uint)(fVar114 < 1.0) & 0x3f800000)
    ;
  }
  auVar107._0_8_ =
       CONCAT44(~-(uint)(fVar114 < 1.0),~-(uint)(fVar137 < 0.0) & (uint)fVar137) &
       0x3f800000ffffffff;
  auVar107._8_8_ = 0;
  auVar108 = auVar107 | ZEXT416((uint)fVar114 & -(uint)(fVar114 < 1.0)) << 0x20;
  fVar95 = auVar108._4_4_;
  auVar82._4_4_ = fVar95;
  auVar82._0_4_ = fVar95;
  auVar82._8_4_ = fVar95;
  auVar82._12_4_ = fVar95;
  auVar262 = _local_418;
  if (fVar95 < auVar108._0_4_) goto LAB_0030b5b3;
  fVar135 = auVar108._0_4_ + -0.1;
  fVar114 = auVar108._8_4_ + 0.0;
  fVar151 = auVar108._12_4_ + 0.0;
  uVar48 = -(uint)(fVar95 + 0.1 < 1.0);
  fVar135 = (float)(~-(uint)(fVar135 < 0.0) & (uint)fVar135);
  fVar137 = (float)(~uVar48 & 0x3f800000 | (uint)(fVar95 + 0.1) & uVar48);
  fVar95 = 1.0 - fVar135;
  fVar223 = 1.0 - fVar135;
  fVar224 = 1.0 - fVar137;
  fVar231 = 1.0 - fVar137;
  fVar189 = auVar126._0_4_ * fVar95 + auVar126._8_4_ * fVar135;
  fVar181 = auVar126._4_4_ * fVar223 + auVar126._12_4_ * fVar135;
  fVar212 = auVar126._0_4_ * fVar224 + auVar126._8_4_ * fVar137;
  fVar213 = auVar126._4_4_ * fVar231 + auVar126._12_4_ * fVar137;
  fVar214 = fVar187 * fVar95 + fVar198 * fVar135;
  fVar222 = fVar188 * fVar223 + fVar152 * fVar135;
  fVar187 = fVar187 * fVar224 + fVar198 * fVar137;
  fVar188 = fVar188 * fVar231 + fVar152 * fVar137;
  fVar198 = fVar179 * fVar95 + fVar199 * fVar135;
  fVar152 = fVar180 * fVar223 + fVar200 * fVar135;
  fVar179 = fVar179 * fVar224 + fVar199 * fVar137;
  fVar180 = fVar180 * fVar231 + fVar200 * fVar137;
  fVar199 = fVar95 * fVar136 + fVar93 * fVar135;
  fVar200 = fVar223 * fVar150 + fVar94 * fVar135;
  fVar223 = fVar224 * fVar136 + auVar61._8_4_ * fVar137;
  fVar224 = fVar231 * fVar150 + auVar61._12_4_ * fVar137;
  fVar136 = fVar53 * fVar114;
  fVar150 = fVar53 * fVar151;
  fVar231 = fVar129 * (1.0 - fVar137);
  fVar95 = fVar129 * (0.0 - fVar114);
  fVar114 = fVar129 * (0.0 - fVar151);
  fVar129 = fVar129 * (1.0 - fVar135) + fVar53 * fVar135;
  fVar53 = fVar231 + fVar53 * fVar137;
  fVar95 = fVar95 + fVar136;
  fVar114 = fVar114 + fVar150;
  fVar115 = 1.0 / fVar115;
  auVar109._0_4_ = fVar223 - fVar199;
  auVar109._4_4_ = fVar224 - fVar200;
  auVar109._8_4_ = fVar223 - fVar223;
  auVar109._12_4_ = fVar224 - fVar224;
  auVar133._0_8_ = CONCAT44(fVar180 - fVar152,fVar179 - fVar198);
  auVar133._8_4_ = fVar179 - fVar179;
  auVar133._12_4_ = fVar180 - fVar180;
  auVar174._0_4_ = fVar187 - fVar214;
  auVar174._4_4_ = fVar188 - fVar222;
  auVar174._8_4_ = fVar187 - fVar187;
  auVar174._12_4_ = fVar188 - fVar188;
  auVar220._0_8_ = CONCAT44((fVar222 - fVar181) * 3.0,(fVar214 - fVar189) * 3.0);
  auVar220._8_4_ = (fVar187 - fVar212) * 3.0;
  auVar220._12_4_ = (fVar188 - fVar213) * 3.0;
  auVar146._0_8_ = CONCAT44((fVar152 - fVar222) * 3.0,(fVar198 - fVar214) * 3.0);
  auVar146._8_4_ = (fVar179 - fVar187) * 3.0;
  auVar146._12_4_ = (fVar180 - fVar188) * 3.0;
  auVar239._0_4_ = (fVar199 - fVar198) * 3.0;
  auVar239._4_4_ = (fVar200 - fVar152) * 3.0;
  auVar239._8_4_ = (fVar223 - fVar179) * 3.0;
  auVar239._12_4_ = (fVar224 - fVar180) * 3.0;
  auVar194._8_4_ = auVar146._8_4_;
  auVar194._0_8_ = auVar146._0_8_;
  auVar194._12_4_ = auVar146._12_4_;
  auVar203 = minps(auVar194,auVar239);
  auVar61 = maxps(auVar146,auVar239);
  auVar227._8_4_ = auVar220._8_4_;
  auVar227._0_8_ = auVar220._0_8_;
  auVar227._12_4_ = auVar220._12_4_;
  auVar120 = minps(auVar227,auVar203);
  auVar102 = maxps(auVar220,auVar61);
  auVar20._4_8_ = auVar61._8_8_;
  auVar20._0_4_ = auVar120._4_4_;
  auVar147._0_8_ = auVar20._0_8_ << 0x20;
  auVar147._8_4_ = auVar120._8_4_;
  auVar147._12_4_ = auVar120._12_4_;
  auVar148._8_8_ = auVar120._8_8_;
  auVar148._0_8_ = auVar147._8_8_;
  auVar21._4_8_ = auVar203._8_8_;
  auVar21._0_4_ = auVar102._4_4_;
  auVar195._0_8_ = auVar21._0_8_ << 0x20;
  auVar195._8_4_ = auVar102._8_4_;
  auVar195._12_4_ = auVar102._12_4_;
  auVar196._8_8_ = auVar102._8_8_;
  auVar196._0_8_ = auVar195._8_8_;
  auVar203 = minps(auVar120,auVar148);
  auVar61 = maxps(auVar102,auVar196);
  fVar231 = auVar203._0_4_ * fVar115;
  fVar233 = auVar203._4_4_ * fVar115;
  fVar236 = auVar203._8_4_ * fVar115;
  fVar243 = auVar203._12_4_ * fVar115;
  fVar179 = fVar115 * auVar61._0_4_;
  fVar180 = fVar115 * auVar61._4_4_;
  fVar200 = fVar115 * auVar61._8_4_;
  fVar115 = fVar115 * auVar61._12_4_;
  fVar223 = 1.0 / (fVar53 - fVar129);
  auVar83._0_8_ = CONCAT44(fVar213 - fVar181,fVar212 - fVar189);
  auVar83._8_4_ = fVar212 - fVar212;
  auVar83._12_4_ = fVar213 - fVar213;
  auVar207._8_4_ = auVar83._8_4_;
  auVar207._0_8_ = auVar83._0_8_;
  auVar207._12_4_ = auVar83._12_4_;
  auVar102 = minps(auVar207,auVar174);
  auVar61 = maxps(auVar83,auVar174);
  auVar127._8_4_ = auVar133._8_4_;
  auVar127._0_8_ = auVar133._0_8_;
  auVar127._12_4_ = auVar133._12_4_;
  auVar203 = minps(auVar127,auVar109);
  auVar102 = minps(auVar102,auVar203);
  auVar203 = maxps(auVar133,auVar109);
  auVar61 = maxps(auVar61,auVar203);
  fVar214 = auVar102._0_4_ * fVar223;
  fVar222 = auVar102._4_4_ * fVar223;
  fVar224 = fVar223 * auVar61._0_4_;
  fVar223 = fVar223 * auVar61._4_4_;
  local_418._4_4_ = fVar129;
  local_418._0_4_ = fVar93;
  fStack_410 = fVar94;
  fStack_40c = fVar53;
  auVar197._4_4_ = fVar53;
  auVar197._0_4_ = fVar94;
  auVar197._8_4_ = fVar128;
  auVar197._12_4_ = fVar116;
  local_1ec = (fVar93 + fVar94) * 0.5;
  fVar188 = (fVar129 + fVar53) * 0.5;
  fVar198 = (fVar94 + fVar128) * 0.0;
  fVar152 = (fVar53 + fVar116) * 0.0;
  fVar135 = local_88 * local_1ec + (float)local_2a8;
  fVar136 = fStack_84 * local_1ec + local_2a8._4_4_;
  fVar137 = fStack_80 * local_1ec + fStack_2a0;
  fVar150 = fStack_7c * local_1ec + fStack_29c;
  fVar151 = local_98 * local_1ec + local_2b8;
  fVar189 = fStack_94 * local_1ec + fStack_2b4;
  fVar181 = fStack_90 * local_1ec + (float)uStack_2b0;
  fVar187 = fStack_8c * local_1ec + uStack_2b0._4_4_;
  fVar135 = (fVar151 - fVar135) * local_1ec + fVar135;
  fVar136 = (fVar189 - fVar136) * local_1ec + fVar136;
  fVar137 = (fVar181 - fVar137) * local_1ec + fVar137;
  fVar150 = (fVar187 - fVar150) * local_1ec + fVar150;
  fVar151 = (((local_a8 * local_1ec + (float)local_2c8) - fVar151) * local_1ec + fVar151) - fVar135;
  fVar189 = (((fStack_a4 * local_1ec + local_2c8._4_4_) - fVar189) * local_1ec + fVar189) - fVar136;
  fVar181 = (((fStack_a0 * local_1ec + fStack_2c0) - fVar181) * local_1ec + fVar181) - fVar137;
  fVar187 = (((fStack_9c * local_1ec + fStack_2bc) - fVar187) * local_1ec + fVar187) - fVar150;
  fVar135 = local_1ec * fVar151 + fVar135;
  fVar136 = local_1ec * fVar189 + fVar136;
  fVar151 = fVar151 * 3.0;
  fVar189 = fVar189 * 3.0;
  fVar137 = (local_1ec * fVar181 + fVar137) - fVar135;
  fVar150 = (local_1ec * fVar187 + fVar150) - fVar136;
  fVar151 = (fVar181 * 3.0 - fVar151) * fVar188 + fVar151;
  fVar189 = (fVar187 * 3.0 - fVar189) * fVar188 + fVar189;
  auVar134._0_8_ = CONCAT44(fVar151,fVar137) ^ 0x80000000;
  auVar134._8_4_ = fVar151;
  auVar134._12_4_ = fVar151;
  fVar244 = fVar93 - local_1ec;
  fVar245 = fVar129 - fVar188;
  fVar246 = fVar94 - fVar198;
  fVar253 = fVar53 - fVar152;
  fVar255 = fVar94 - local_1ec;
  fVar257 = fVar53 - fVar188;
  fVar128 = fVar128 - fVar198;
  fVar116 = fVar116 - fVar152;
  fVar135 = fVar137 * fVar188 + fVar135;
  fVar136 = fVar150 * fVar188 + fVar136;
  auVar149._0_8_ = CONCAT44(fVar189,fVar150) ^ 0x8000000000000000;
  auVar149._8_4_ = -fVar189;
  auVar149._12_4_ = -fVar189;
  auVar84._0_4_ = fVar150 * fVar151 - fVar189 * fVar137;
  auVar84._4_4_ = auVar84._0_4_;
  auVar84._8_4_ = auVar84._0_4_;
  auVar84._12_4_ = auVar84._0_4_;
  auVar203 = divps(auVar149,auVar84);
  auVar61 = divps(auVar134,auVar84);
  fVar187 = auVar203._0_4_;
  fVar198 = auVar203._4_4_;
  fVar189 = auVar61._0_4_;
  fVar181 = auVar61._4_4_;
  local_1ec = local_1ec - (fVar136 * fVar189 + fVar135 * fVar187);
  fStack_1e8 = fVar188 - (fVar136 * fVar181 + fVar135 * fVar198);
  fVar151 = fVar188 - (fVar136 * auVar61._8_4_ + fVar135 * auVar203._8_4_);
  fVar188 = fVar188 - (fVar136 * auVar61._12_4_ + fVar135 * auVar203._12_4_);
  auVar110._0_8_ = CONCAT44(fVar198 * fVar214,fVar198 * fVar231);
  auVar110._8_4_ = fVar198 * fVar233;
  auVar110._12_4_ = fVar198 * fVar222;
  auVar85._0_4_ = fVar198 * fVar179;
  auVar85._4_4_ = fVar198 * fVar224;
  auVar85._8_4_ = fVar198 * fVar180;
  auVar85._12_4_ = fVar198 * fVar223;
  auVar268._8_4_ = auVar110._8_4_;
  auVar268._0_8_ = auVar110._0_8_;
  auVar268._12_4_ = auVar110._12_4_;
  auVar120 = minps(auVar268,auVar85);
  auVar61 = maxps(auVar85,auVar110);
  auVar175._0_8_ = CONCAT44(fVar181 * fVar222,fVar181 * fVar233);
  auVar175._8_4_ = fVar181 * fVar236;
  auVar175._12_4_ = fVar181 * fVar243;
  auVar111._0_4_ = fVar181 * fVar180;
  auVar111._4_4_ = fVar181 * fVar223;
  auVar111._8_4_ = fVar181 * fVar200;
  auVar111._12_4_ = fVar181 * fVar115;
  auVar228._8_4_ = auVar175._8_4_;
  auVar228._0_8_ = auVar175._0_8_;
  auVar228._12_4_ = auVar175._12_4_;
  auVar102 = minps(auVar228,auVar111);
  auVar203 = maxps(auVar111,auVar175);
  fVar135 = 0.0 - (auVar203._0_4_ + auVar61._0_4_);
  fVar136 = 1.0 - (auVar203._4_4_ + auVar61._4_4_);
  fVar137 = 0.0 - (auVar203._8_4_ + auVar61._8_4_);
  fVar150 = 0.0 - (auVar203._12_4_ + auVar61._12_4_);
  fVar152 = 0.0 - (auVar102._0_4_ + auVar120._0_4_);
  fVar199 = 1.0 - (auVar102._4_4_ + auVar120._4_4_);
  fVar212 = 0.0 - (auVar102._8_4_ + auVar120._8_4_);
  fVar213 = 0.0 - (auVar102._12_4_ + auVar120._12_4_);
  auVar112._0_8_ = CONCAT44(fVar245 * fVar136,fVar244 * fVar135);
  auVar112._8_4_ = fVar246 * fVar137;
  auVar112._12_4_ = fVar253 * fVar150;
  auVar240._0_8_ = CONCAT44(fVar214 * fVar187,fVar231 * fVar187);
  auVar240._8_4_ = fVar233 * fVar187;
  auVar240._12_4_ = fVar222 * fVar187;
  auVar176._0_4_ = fVar187 * fVar179;
  auVar176._4_4_ = fVar187 * fVar224;
  auVar176._8_4_ = fVar187 * fVar180;
  auVar176._12_4_ = fVar187 * fVar223;
  auVar229._8_4_ = auVar240._8_4_;
  auVar229._0_8_ = auVar240._0_8_;
  auVar229._12_4_ = auVar240._12_4_;
  auVar203 = minps(auVar229,auVar176);
  auVar61 = maxps(auVar176,auVar240);
  auVar208._0_8_ = CONCAT44(fVar222 * fVar189,fVar233 * fVar189);
  auVar208._8_4_ = fVar236 * fVar189;
  auVar208._12_4_ = fVar243 * fVar189;
  auVar241._0_4_ = fVar189 * fVar180;
  auVar241._4_4_ = fVar189 * fVar223;
  auVar241._8_4_ = fVar189 * fVar200;
  auVar241._12_4_ = fVar189 * fVar115;
  auVar267._8_4_ = auVar208._8_4_;
  auVar267._0_8_ = auVar208._0_8_;
  auVar267._12_4_ = auVar208._12_4_;
  auVar120 = minps(auVar267,auVar241);
  auVar230._0_4_ = fVar244 * fVar152;
  auVar230._4_4_ = fVar245 * fVar199;
  auVar230._8_4_ = fVar246 * fVar212;
  auVar230._12_4_ = fVar253 * fVar213;
  auVar86._0_8_ = CONCAT44(fVar136 * fVar257,fVar135 * fVar255);
  auVar86._8_4_ = fVar137 * fVar128;
  auVar86._12_4_ = fVar150 * fVar116;
  auVar186._0_4_ = fVar152 * fVar255;
  auVar186._4_4_ = fVar199 * fVar257;
  auVar186._8_4_ = fVar212 * fVar128;
  auVar186._12_4_ = fVar213 * fVar116;
  auVar102 = maxps(auVar241,auVar208);
  fVar115 = 1.0 - (auVar102._0_4_ + auVar61._0_4_);
  fVar135 = 0.0 - (auVar102._4_4_ + auVar61._4_4_);
  fVar136 = 0.0 - (auVar102._8_4_ + auVar61._8_4_);
  fVar137 = 0.0 - (auVar102._12_4_ + auVar61._12_4_);
  fVar150 = 1.0 - (auVar120._0_4_ + auVar203._0_4_);
  fVar152 = 0.0 - (auVar120._4_4_ + auVar203._4_4_);
  fVar179 = 0.0 - (auVar120._8_4_ + auVar203._8_4_);
  fVar180 = 0.0 - (auVar120._12_4_ + auVar203._12_4_);
  auVar209._0_8_ = CONCAT44(fVar245 * fVar135,fVar244 * fVar115);
  auVar209._8_4_ = fVar246 * fVar136;
  auVar209._12_4_ = fVar253 * fVar137;
  auVar252._0_4_ = fVar244 * fVar150;
  auVar252._4_4_ = fVar245 * fVar152;
  auVar252._8_4_ = fVar246 * fVar179;
  auVar252._12_4_ = fVar253 * fVar180;
  auVar177._0_8_ = CONCAT44(fVar135 * fVar257,fVar115 * fVar255);
  auVar177._8_4_ = fVar136 * fVar128;
  auVar177._12_4_ = fVar137 * fVar116;
  auVar221._0_4_ = fVar150 * fVar255;
  auVar221._4_4_ = fVar152 * fVar257;
  auVar221._8_4_ = fVar179 * fVar128;
  auVar221._12_4_ = fVar180 * fVar116;
  auVar242._8_4_ = auVar209._8_4_;
  auVar242._0_8_ = auVar209._0_8_;
  auVar242._12_4_ = auVar209._12_4_;
  auVar61 = minps(auVar242,auVar252);
  auVar261._8_4_ = auVar177._8_4_;
  auVar261._0_8_ = auVar177._0_8_;
  auVar261._12_4_ = auVar177._12_4_;
  auVar262 = minps(auVar261,auVar221);
  auVar216 = minps(auVar61,auVar262);
  auVar203 = maxps(auVar252,auVar209);
  auVar61 = maxps(auVar221,auVar177);
  auVar102 = maxps(auVar61,auVar203);
  auVar210._8_4_ = auVar112._8_4_;
  auVar210._0_8_ = auVar112._0_8_;
  auVar210._12_4_ = auVar112._12_4_;
  auVar203 = minps(auVar210,auVar230);
  auVar178._8_4_ = auVar86._8_4_;
  auVar178._0_8_ = auVar86._0_8_;
  auVar178._12_4_ = auVar86._12_4_;
  auVar61 = minps(auVar178,auVar186);
  auVar203 = minps(auVar203,auVar61);
  auVar120 = maxps(auVar230,auVar112);
  auVar61 = maxps(auVar186,auVar86);
  auVar61 = maxps(auVar61,auVar120);
  auVar211._0_4_ = auVar216._4_4_ + auVar216._0_4_ + local_1ec;
  auVar211._4_4_ = auVar203._4_4_ + auVar203._0_4_ + fStack_1e8;
  auVar211._8_4_ = auVar216._8_4_ + auVar216._4_4_ + fVar151;
  auVar211._12_4_ = auVar216._12_4_ + auVar203._4_4_ + fVar188;
  fVar115 = auVar102._4_4_ + auVar102._0_4_ + local_1ec;
  fVar116 = auVar61._4_4_ + auVar61._0_4_ + fStack_1e8;
  auVar87._4_4_ = fVar116;
  auVar87._0_4_ = fVar115;
  auVar108 = maxps(_local_418,auVar211);
  auVar87._8_4_ = auVar102._8_4_ + auVar102._4_4_ + fVar151;
  auVar87._12_4_ = auVar102._12_4_ + auVar61._4_4_ + fVar188;
  auVar61 = minps(auVar87,auVar197);
  iVar47 = -(uint)(auVar61._0_4_ < auVar108._0_4_);
  iVar49 = -(uint)(auVar61._4_4_ < auVar108._4_4_);
  auVar88._4_4_ = iVar49;
  auVar88._0_4_ = iVar47;
  auVar88._8_4_ = iVar49;
  auVar88._12_4_ = iVar49;
  auVar82._8_8_ = auVar88._8_8_;
  auVar82._4_4_ = (float)iVar47;
  auVar82._0_4_ = (float)iVar47;
  iVar47 = movmskpd((uint)(fVar130 < 0.0),auVar82);
  if (iVar47 != 0) goto LAB_0030b5b3;
  bVar41 = 0;
  if ((fVar93 < auVar211._0_4_) && (fVar115 < fVar94)) {
    bVar41 = -(fVar116 < fVar53) & fVar129 < auVar211._4_4_;
  }
  bVar41 = bVar45 | bVar41;
  uVar42 = (ulong)CONCAT31(uVar19,bVar41);
  if (bVar41 != 1) goto LAB_0030af59;
  local_288.ray = (RTCRayN *)0xc9;
  do {
    local_288.ray = (RTCRayN *)((long)local_288.ray + -1);
    auVar262 = local_b8;
    if (local_288.ray == (RTCRayN *)0x0) goto LAB_0030b5b3;
    fVar53 = 1.0 - local_1ec;
    fVar114 = local_1ec * local_1ec * local_1ec;
    fVar95 = local_1ec * local_1ec * 3.0 * fVar53;
    fVar129 = fVar53 * fVar53 * fVar53;
    fVar115 = local_1ec * 3.0 * fVar53 * fVar53;
    fVar53 = fVar129 * (float)local_2a8 +
             fVar115 * local_2b8 + fVar95 * (float)local_2c8 + fVar114 * local_b8._0_4_;
    fVar93 = fVar129 * local_2a8._4_4_ +
             fVar115 * fStack_2b4 + fVar95 * local_2c8._4_4_ + fVar114 * local_b8._4_4_;
    fVar94 = fVar129 * fStack_2a0 +
             fVar115 * (float)uStack_2b0 + fVar95 * fStack_2c0 + fVar114 * local_b8._8_4_;
    fVar95 = fVar129 * fStack_29c +
             fVar115 * uStack_2b0._4_4_ + fVar95 * fStack_2bc + fVar114 * local_b8._12_4_;
    fVar114 = (fVar94 - fVar53) * fStack_1e8;
    fVar115 = (fVar95 - fVar93) * fStack_1e8;
    fVar129 = (fVar94 - fVar53) * fStack_1e8 + fVar53;
    fVar94 = (fVar95 - fVar93) * fStack_1e8 + fVar93;
    local_1ec = local_1ec - (fVar94 * fVar189 + fVar129 * fVar187);
    fStack_1e8 = fStack_1e8 - (fVar94 * fVar181 + fVar129 * fVar198);
    fVar95 = ABS(fVar94);
    auVar82._0_8_ = CONCAT44(fVar94,fVar129) & 0x7fffffff7fffffff;
    auVar82._8_4_ = ABS(fVar114 + fVar53);
    auVar82._12_4_ = ABS(fVar115 + fVar93);
    auVar108._0_8_ = CONCAT44(fVar94,fVar94) & 0x7fffffff7fffffff;
    auVar108._8_4_ = fVar95;
    auVar108._12_4_ = fVar95;
    if (fVar95 <= ABS(fVar129)) {
      auVar108._0_4_ = ABS(fVar129);
    }
  } while (local_c8 <= auVar108._0_4_);
  if ((((local_1ec < 0.0) || (1.0 < local_1ec)) ||
      (auVar108._4_4_ = fStack_1e8, auVar108._0_4_ = fStack_1e8, auVar108._8_4_ = fStack_1e8,
      auVar108._12_4_ = fStack_1e8, fStack_1e8 < 0.0)) || (1.0 < fStack_1e8)) goto LAB_0030b5b3;
  fVar129 = (pre->ray_space).vx.field_0.m128[2];
  fVar53 = (pre->ray_space).vy.field_0.m128[2];
  fVar93 = (pre->ray_space).vz.field_0.m128[2];
  fVar94 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar95 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar114 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar115 = (ray->super_RayK<1>).org.field_0.m128[3];
  auVar89._0_4_ = (local_368 - fVar94) * fVar129;
  auVar89._4_4_ = (fStack_364 - fVar95) * fVar53;
  auVar89._8_4_ = (fStack_360 - fVar114) * fVar93;
  auVar89._12_4_ = (fStack_35c - fVar115) * 0.0;
  auVar90._8_8_ = auVar89._8_8_;
  auVar90._0_8_ = auVar90._8_8_;
  auVar82._4_12_ = auVar90._4_12_;
  fVar137 = 1.0 - fStack_1e8;
  fVar136 = 1.0 - local_1ec;
  fVar116 = fVar136 * fVar136 * fVar136;
  fVar128 = local_1ec * 3.0 * fVar136 * fVar136;
  fVar135 = local_1ec * local_1ec * local_1ec;
  fVar130 = local_1ec * local_1ec * 3.0 * fVar136;
  auVar82._0_4_ =
       ((auVar89._8_4_ + auVar89._4_4_ + auVar89._0_4_) * fVar137 +
       ((fStack_350 - fVar114) * fVar93 +
       (fStack_354 - fVar95) * fVar53 + (local_358 - fVar94) * fVar129) * fStack_1e8) * fVar116 +
       (((fStack_370 - fVar114) * fVar93 +
        (fStack_374 - fVar95) * fVar53 + (local_378 - fVar94) * fVar129) * fVar137 +
       ((fStack_210 - fVar114) * fVar93 +
       (fStack_214 - fVar95) * fVar53 + (local_218 - fVar94) * fVar129) * fStack_1e8) * fVar128 +
       (((fStack_390 - fVar114) * fVar93 +
        (fStack_394 - fVar95) * fVar53 + (local_398 - fVar94) * fVar129) * fVar137 +
       ((fStack_3a0 - fVar114) * fVar93 +
       (fStack_3a4 - fVar95) * fVar53 + (local_3a8 - fVar94) * fVar129) * fStack_1e8) * fVar130 +
       (fVar137 * ((fStack_380 - fVar114) * fVar93 +
                  (fStack_384 - fVar95) * fVar53 + (local_388 - fVar94) * fVar129) +
       ((fStack_3c0 - fVar114) * fVar93 +
       (fStack_3c4 - fVar95) * fVar53 + (local_3d4.m128[3] - fVar94) * fVar129) * fStack_1e8) *
       fVar135;
  if (auVar82._0_4_ < fVar115) goto LAB_0030b5b3;
  fVar129 = (ray->super_RayK<1>).tfar;
  auVar262 = ZEXT416((uint)fVar129);
  if (fVar129 < auVar82._0_4_) goto LAB_0030b5b3;
  fVar114 = 1.0 - fStack_1e8;
  fVar115 = 1.0 - fStack_1e8;
  fVar137 = 1.0 - fStack_1e8;
  fVar150 = 1.0 - fStack_1e8;
  fVar53 = local_378 * fVar114 + local_218 * fStack_1e8;
  fVar93 = fStack_374 * fVar115 + fStack_214 * fStack_1e8;
  fVar94 = fStack_370 * fVar137 + fStack_210 * fStack_1e8;
  fVar95 = fStack_36c * fVar150 + fStack_20c * fStack_1e8;
  fVar151 = local_398 * fVar114 + local_3a8 * fStack_1e8;
  fVar181 = fStack_394 * fVar115 + fStack_3a4 * fStack_1e8;
  fVar188 = fStack_390 * fVar137 + fStack_3a0 * fStack_1e8;
  fVar152 = fStack_38c * fVar150 + fStack_39c * fStack_1e8;
  fVar189 = fVar151 - fVar53;
  fVar187 = fVar181 - fVar93;
  fVar198 = fVar188 - fVar94;
  fVar179 = fVar152 - fVar95;
  auVar108._4_4_ = local_1ec;
  auVar108._0_4_ = local_1ec;
  auVar108._8_4_ = local_1ec;
  auVar108._12_4_ = local_1ec;
  fVar53 = (((fVar53 - (local_368 * fVar114 + local_358 * fStack_1e8)) * fVar136 +
            local_1ec * fVar189) * fVar136 +
           (fVar189 * fVar136 +
           ((fVar114 * local_388 + fStack_1e8 * local_3d4.m128[3]) - fVar151) * local_1ec) *
           local_1ec) * 3.0;
  fVar93 = (((fVar93 - (fStack_364 * fVar115 + fStack_354 * fStack_1e8)) * fVar136 +
            local_1ec * fVar187) * fVar136 +
           (fVar187 * fVar136 +
           ((fVar115 * fStack_384 + fStack_1e8 * fStack_3c4) - fVar181) * local_1ec) * local_1ec) *
           3.0;
  fVar94 = (((fVar94 - (fStack_360 * fVar137 + fStack_350 * fStack_1e8)) * fVar136 +
            local_1ec * fVar198) * fVar136 +
           (fVar198 * fVar136 +
           ((fVar137 * fStack_380 + fStack_1e8 * fStack_3c0) - fVar188) * local_1ec) * local_1ec) *
           3.0;
  fVar95 = (((fVar95 - (fStack_35c * fVar150 + fStack_34c * fStack_1e8)) * fVar136 +
            local_1ec * fVar179) * fVar136 +
           (fVar179 * fVar136 +
           ((fVar150 * fStack_37c + fStack_1e8 * fStack_3bc) - fVar152) * local_1ec) * local_1ec) *
           3.0;
  pGVar5 = (pRVar40->scene->geometries).items[uVar46].ptr;
  uVar48 = (ray->super_RayK<1>).mask;
  local_288.ray = (RTCRayN *)(ulong)uVar48;
  if ((pGVar5->mask & uVar48) == 0) goto LAB_0030b5b3;
  fVar114 = fVar116 * local_188 + fVar128 * local_198 + fVar130 * local_1a8 + fVar135 * local_1b8;
  fVar115 = fVar116 * fStack_184 +
            fVar128 * fStack_194 + fVar130 * fStack_1a4 + fVar135 * fStack_1b4;
  fVar136 = fVar116 * fStack_180 +
            fVar128 * fStack_190 + fVar130 * fStack_1a0 + fVar135 * fStack_1b0;
  fVar116 = fVar116 * fStack_17c +
            fVar128 * fStack_18c + fVar130 * fStack_19c + fVar135 * fStack_1ac;
  auVar108._0_4_ = fVar115 * fVar53 - fVar93 * fVar114;
  auVar108._4_4_ = fVar136 * fVar93 - fVar94 * fVar115;
  auVar108._8_4_ = fVar114 * fVar94 - fVar53 * fVar136;
  auVar108._12_4_ = fVar116 * fVar95 - fVar95 * fVar116;
  local_1f8 = CONCAT44(auVar108._8_4_,auVar108._4_4_);
  if ((pRVar40->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = auVar82._0_4_;
    *(undefined8 *)&(ray->Ng).field_0 = local_1f8;
    (ray->Ng).field_0.field_0.z = auVar108._0_4_;
    ray->u = local_1ec;
    ray->v = fStack_1e8;
    ray->primID = (uint)local_3d4._4_8_;
    ray->geomID = uVar46;
    ray->instID[0] = pRVar40->user->instID[0];
    uVar48 = pRVar40->user->instPrimID[0];
    local_288.ray = (RTCRayN *)(ulong)uVar48;
    ray->instPrimID[0] = uVar48;
    goto LAB_0030b5b3;
  }
  local_1f0 = auVar108._0_4_;
  local_1e4 = (uint)local_3d4._4_8_;
  local_1e0 = uVar46;
  local_1dc = pRVar40->user->instID[0];
  local_1d8 = pRVar40->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = auVar82._0_4_;
  local_3d4.m128[0] = -NAN;
  local_288.valid = (int *)&local_3d4;
  local_288.geometryUserPtr = pGVar5->userPtr;
  local_288.context = pRVar40->user;
  local_288.ray = (RTCRayN *)ray;
  local_288.hit = (RTCHitN *)&local_1f8;
  local_288.N = 1;
  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    (*pGVar5->intersectionFilterN)(&local_288);
    auVar108._8_8_ = extraout_XMM1_Qb;
    auVar108._0_8_ = extraout_XMM1_Qa;
    if (*(float *)local_288.valid == 0.0) goto LAB_0030c631;
  }
  p_Var6 = pRVar40->args->filter;
  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
     (((pRVar40->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var6)(&local_288);
    auVar108._8_8_ = extraout_XMM1_Qb_00;
    auVar108._0_8_ = extraout_XMM1_Qa_00;
    if (*(float *)local_288.valid == 0.0) {
LAB_0030c631:
      auVar82 = ZEXT416((uint)fVar129);
      (ray->super_RayK<1>).tfar = fVar129;
      local_288.ray = (RTCRayN *)local_288.valid;
      goto LAB_0030b5b3;
    }
  }
  *(float *)((long)local_288.ray + 0x30) = *(float *)local_288.hit;
  *(float *)((long)local_288.ray + 0x34) = *(float *)(local_288.hit + 4);
  *(float *)((long)local_288.ray + 0x38) = *(float *)(local_288.hit + 8);
  *(float *)((long)local_288.ray + 0x3c) = *(float *)(local_288.hit + 0xc);
  auVar82 = ZEXT416((uint)*(float *)(local_288.hit + 0x10));
  *(float *)((long)local_288.ray + 0x40) = *(float *)(local_288.hit + 0x10);
  *(float *)((long)local_288.ray + 0x44) = *(float *)(local_288.hit + 0x14);
  *(float *)((long)local_288.ray + 0x48) = *(float *)(local_288.hit + 0x18);
  *(float *)((long)local_288.ray + 0x4c) = *(float *)(local_288.hit + 0x1c);
  *(float *)((long)local_288.ray + 0x50) = *(float *)(local_288.hit + 0x20);
  goto LAB_0030b5b3;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }